

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O3

int __thiscall
ncnn::BinaryOp::forward
          (BinaryOp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  pointer pMVar7;
  Mat *this_00;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  Allocator *pAVar11;
  size_t sVar12;
  int *piVar13;
  uint uVar14;
  void *pvVar15;
  void *pvVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  void *pvVar22;
  ulong uVar23;
  void *pvVar24;
  void *pvVar25;
  long lVar26;
  size_t sVar27;
  size_t sVar28;
  float fVar29;
  float fVar30;
  ulong local_68;
  void *local_58;
  void *local_50;
  void *local_48;
  
  if (8 < (uint)this->op_type) {
    return 0;
  }
  pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  switch(this->op_type) {
  case 0:
    uVar1 = pMVar7->w;
    sVar27 = (size_t)(int)uVar1;
    iVar2 = pMVar7->h;
    lVar18 = (long)iVar2;
    uVar14 = iVar2 * uVar1;
    sVar8 = pMVar7->elemsize;
    uVar3 = pMVar7[1].w;
    sVar28 = (size_t)(int)uVar3;
    iVar4 = pMVar7[1].h;
    lVar26 = (long)iVar4;
    uVar5 = pMVar7[1].c;
    uVar21 = (ulong)uVar5;
    iVar6 = pMVar7->dims;
    if (iVar6 != 1) {
      if (iVar6 != 2) {
        if (iVar6 != 3) {
          return 0;
        }
        uVar3 = pMVar7->c;
        uVar21 = (ulong)uVar3;
        Mat::create(this_00,uVar1,iVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        iVar4 = pMVar7[1].dims;
        if (iVar4 != 1) {
          if (iVar4 == 3) {
            if (0 < (int)uVar3) {
              pvVar16 = pMVar7->data;
              sVar27 = pMVar7->elemsize;
              pvVar22 = pMVar7[1].data;
              sVar28 = pMVar7[1].elemsize;
              sVar9 = this_00->elemsize;
              sVar10 = pMVar7[1].cstep;
              sVar12 = pMVar7->cstep;
              uVar23 = 0;
              do {
                if (0 < (int)uVar14) {
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar22 + uVar19 * 4) +
                         *(float *)((long)pvVar16 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar14 != uVar19);
                }
                uVar23 = uVar23 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
                pvVar22 = (void *)((long)pvVar22 + sVar28 * sVar10);
                pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar12);
              } while (uVar23 != uVar21);
              return 0;
            }
            return 0;
          }
          if (iVar4 != 2) {
            return 0;
          }
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar28 = pMVar7->elemsize;
            pvVar22 = pMVar7[1].data;
            sVar9 = this_00->elemsize;
            sVar10 = pMVar7->cstep;
            uVar23 = 0;
            do {
              if (0 < iVar2) {
                lVar26 = 0;
                pvVar24 = pvVar16;
                pvVar25 = pvVar15;
                do {
                  if (0 < (int)uVar1) {
                    fVar30 = *(float *)((long)pvVar22 + lVar26 * 4 + uVar23 * lVar18 * 4);
                    uVar19 = 0;
                    do {
                      *(float *)((long)pvVar25 + uVar19 * 4) =
                           *(float *)((long)pvVar24 + uVar19 * 4) + fVar30;
                      uVar19 = uVar19 + 1;
                    } while (uVar1 != uVar19);
                  }
                  lVar26 = lVar26 + 1;
                  pvVar25 = (void *)((long)pvVar25 + sVar27 * 4);
                  pvVar24 = (void *)((long)pvVar24 + sVar27 * 4);
                } while (lVar26 != lVar18);
              }
              uVar23 = uVar23 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
              pvVar16 = (void *)((long)pvVar16 + sVar28 * sVar10);
            } while (uVar23 != uVar21);
            return 0;
          }
          return 0;
        }
        if (pMVar7[1].w != 1) {
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar27 = pMVar7->elemsize;
            pvVar22 = pMVar7[1].data;
            sVar28 = this_00->elemsize;
            sVar9 = pMVar7->cstep;
            uVar23 = 0;
            do {
              if (0 < (int)uVar14) {
                fVar30 = *(float *)((long)pvVar22 + uVar23 * 4);
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar19 * 4) =
                       *(float *)((long)pvVar16 + uVar19 * 4) + fVar30;
                  uVar19 = uVar19 + 1;
                } while (uVar14 != uVar19);
              }
              uVar23 = uVar23 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
              pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
            } while (uVar23 != uVar21);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar3) {
          fVar30 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          sVar27 = pMVar7->elemsize;
          sVar28 = this_00->elemsize;
          sVar9 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar19 = 0;
              do {
                *(float *)((long)pvVar15 + uVar19 * 4) =
                     *(float *)((long)pvVar16 + uVar19 * 4) + fVar30;
                uVar19 = uVar19 + 1;
              } while (uVar14 != uVar19);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
            pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
          } while (uVar23 != uVar21);
          return 0;
        }
        return 0;
      }
      if (pMVar7[1].dims == 3) {
        Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 != 0) {
          if (0 < (int)uVar5) {
            pvVar16 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            sVar27 = pMVar7[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = pMVar7[1].cstep;
            uVar23 = 0;
            do {
              if (0 < iVar4) {
                lVar18 = 0;
                pvVar24 = pvVar22;
                pvVar25 = pvVar15;
                do {
                  if (0 < (int)uVar3) {
                    fVar30 = *(float *)((long)pvVar16 + lVar18 * 4 + uVar23 * lVar26 * 4);
                    uVar19 = 0;
                    do {
                      *(float *)((long)pvVar25 + uVar19 * 4) =
                           *(float *)((long)pvVar24 + uVar19 * 4) + fVar30;
                      uVar19 = uVar19 + 1;
                    } while (uVar3 != uVar19);
                  }
                  lVar18 = lVar18 + 1;
                  pvVar25 = (void *)((long)pvVar25 + sVar28 * 4);
                  pvVar24 = (void *)((long)pvVar24 + sVar28 * 4);
                } while (lVar18 != lVar26);
              }
              uVar23 = uVar23 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar27 * sVar10);
            } while (uVar23 != uVar21);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar7[1].dims != 1) {
        if (pMVar7[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar14) {
          pvVar16 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) =
                 *(float *)((long)pvVar22 + uVar21 * 4) + *(float *)((long)pvVar16 + uVar21 * 4);
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
          return 0;
        }
        return 0;
      }
      Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (pMVar7[1].w != 1) {
          if (0 < iVar2) {
            pvVar16 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            lVar26 = 0;
            do {
              if (0 < (int)uVar1) {
                fVar30 = *(float *)((long)pvVar22 + lVar26 * 4);
                uVar21 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar21 * 4) =
                       *(float *)((long)pvVar16 + uVar21 * 4) + fVar30;
                  uVar21 = uVar21 + 1;
                } while (uVar1 != uVar21);
              }
              lVar26 = lVar26 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar27 * 4);
              pvVar16 = (void *)((long)pvVar16 + sVar27 * 4);
            } while (lVar26 != lVar18);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar14) {
          fVar30 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = *(float *)((long)pvVar16 + uVar21 * 4) + fVar30
            ;
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    uVar17 = iVar4 * uVar3;
    iVar2 = pMVar7[1].dims;
    if (uVar1 != 1) {
      if (iVar2 == 1) {
        pAVar11 = opt->blob_allocator;
        if (((this_00->dims == 1) && (this_00->w == uVar1)) &&
           ((this_00->elemsize == sVar8 && (this_00->allocator == pAVar11)))) {
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
        }
        else {
          piVar13 = this_00->refcount;
          if (piVar13 != (int *)0x0) {
            LOCK();
            *piVar13 = *piVar13 + -1;
            UNLOCK();
            if (*piVar13 == 0) {
              if (this_00->allocator == (Allocator *)0x0) {
                if (this_00->data != (void *)0x0) {
                  free(*(void **)((long)this_00->data + -8));
                }
              }
              else {
                (**(code **)(*(long *)this_00->allocator + 8))();
              }
            }
          }
          this_00->data = (void *)0x0;
          this_00->refcount = (int *)0x0;
          this_00->elemsize = sVar8;
          this_00->allocator = pAVar11;
          this_00->dims = 1;
          this_00->w = uVar1;
          this_00->h = 1;
          this_00->c = 1;
          this_00->cstep = sVar27;
          if (uVar1 == 0) {
            return -100;
          }
          uVar21 = sVar8 * sVar27 + 3 & 0xfffffffffffffffc;
          if (pAVar11 == (Allocator *)0x0) {
            pvVar16 = malloc(uVar21 + 0x1c);
            pvVar15 = (void *)((long)pvVar16 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar15 + -8) = pvVar16;
          }
          else {
            pvVar15 = (void *)(*(code *)**(undefined8 **)pAVar11)();
          }
          this_00->data = pvVar15;
          this_00->refcount = (int *)((long)pvVar15 + uVar21);
          *(undefined4 *)((long)pvVar15 + uVar21) = 1;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w == 1) {
          if (0 < (int)uVar14) {
            fVar30 = *pMVar7[1].data;
            pvVar16 = pMVar7->data;
            uVar21 = 0;
            do {
              *(float *)((long)pvVar15 + uVar21 * 4) =
                   *(float *)((long)pvVar16 + uVar21 * 4) + fVar30;
              uVar21 = uVar21 + 1;
            } while (uVar14 != uVar21);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar14) {
          pvVar16 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) =
                 *(float *)((long)pvVar22 + uVar21 * 4) + *(float *)((long)pvVar16 + uVar21 * 4);
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
          return 0;
        }
        return 0;
      }
      if (iVar2 == 2) {
        Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < iVar4) {
            pvVar16 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            lVar18 = 0;
            do {
              if (0 < (int)uVar3) {
                fVar30 = *(float *)((long)pvVar16 + lVar18 * 4);
                uVar21 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar21 * 4) =
                       *(float *)((long)pvVar22 + uVar21 * 4) + fVar30;
                  uVar21 = uVar21 + 1;
                } while (uVar3 != uVar21);
              }
              lVar18 = lVar18 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar28 * 4);
              pvVar22 = (void *)((long)pvVar22 + sVar28 * 4);
            } while (lVar18 != lVar26);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar2 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 != (void *)0x0) {
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if (0 < (int)uVar5) {
          pvVar16 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          sVar27 = pMVar7[1].elemsize;
          sVar28 = this_00->elemsize;
          sVar9 = pMVar7[1].cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar17) {
              fVar30 = *(float *)((long)pvVar16 + uVar23 * 4);
              uVar19 = 0;
              do {
                *(float *)((long)pvVar15 + uVar19 * 4) =
                     *(float *)((long)pvVar22 + uVar19 * 4) + fVar30;
                uVar19 = uVar19 + 1;
              } while (uVar17 != uVar19);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
            pvVar22 = (void *)((long)pvVar22 + sVar27 * sVar9);
          } while (uVar23 != uVar21);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar2 != 1) {
      if (iVar2 == 2) {
        Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar17) {
            fVar30 = *pMVar7->data;
            pvVar16 = pMVar7[1].data;
            uVar21 = 0;
            do {
              *(float *)((long)pvVar15 + uVar21 * 4) =
                   *(float *)((long)pvVar16 + uVar21 * 4) + fVar30;
              uVar21 = uVar21 + 1;
            } while (uVar17 != uVar21);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar2 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 != (void *)0x0) {
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if (0 < (int)uVar5) {
          fVar30 = *pMVar7->data;
          pvVar16 = pMVar7[1].data;
          sVar27 = pMVar7[1].elemsize;
          sVar28 = this_00->elemsize;
          sVar9 = pMVar7[1].cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar17) {
              uVar19 = 0;
              do {
                *(float *)((long)pvVar15 + uVar19 * 4) =
                     *(float *)((long)pvVar16 + uVar19 * 4) + fVar30;
                uVar19 = uVar19 + 1;
              } while (uVar17 != uVar19);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
            pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
          } while (uVar23 != uVar21);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    pAVar11 = opt->blob_allocator;
    if (((this_00->dims == 1) && (this_00->w == uVar3)) &&
       ((this_00->elemsize == sVar8 && (this_00->allocator == pAVar11)))) {
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
    }
    else {
      piVar13 = this_00->refcount;
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (this_00->allocator == (Allocator *)0x0) {
            if (this_00->data != (void *)0x0) {
              free(*(void **)((long)this_00->data + -8));
            }
          }
          else {
            (**(code **)(*(long *)this_00->allocator + 8))();
          }
        }
      }
      this_00->data = (void *)0x0;
      this_00->refcount = (int *)0x0;
      this_00->elemsize = sVar8;
      this_00->allocator = pAVar11;
      this_00->dims = 1;
      this_00->w = uVar3;
      this_00->h = 1;
      this_00->c = 1;
      this_00->cstep = sVar28;
      if (uVar3 == 0) {
        return -100;
      }
      uVar21 = sVar8 * sVar28 + 3 & 0xfffffffffffffffc;
      if (pAVar11 == (Allocator *)0x0) {
        pvVar16 = malloc(uVar21 + 0x1c);
        pvVar15 = (void *)((long)pvVar16 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar15 + -8) = pvVar16;
      }
      else {
        pvVar15 = (void *)(*(code *)**(undefined8 **)pAVar11)(pAVar11);
      }
      this_00->data = pvVar15;
      this_00->refcount = (int *)((long)pvVar15 + uVar21);
      *(undefined4 *)((long)pvVar15 + uVar21) = 1;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if ((int)uVar17 < 1) {
      return 0;
    }
    fVar30 = *pMVar7->data;
    pvVar16 = pMVar7[1].data;
    uVar21 = 0;
    do {
      *(float *)((long)pvVar15 + uVar21 * 4) = *(float *)((long)pvVar16 + uVar21 * 4) + fVar30;
      uVar21 = uVar21 + 1;
    } while (uVar17 != uVar21);
    break;
  case 1:
    uVar1 = pMVar7->w;
    sVar27 = (size_t)(int)uVar1;
    iVar2 = pMVar7->h;
    lVar18 = (long)iVar2;
    uVar14 = iVar2 * uVar1;
    sVar8 = pMVar7->elemsize;
    uVar3 = pMVar7[1].w;
    sVar28 = (size_t)(int)uVar3;
    iVar4 = pMVar7[1].h;
    lVar26 = (long)iVar4;
    uVar5 = pMVar7[1].c;
    uVar21 = (ulong)uVar5;
    iVar6 = pMVar7->dims;
    if (iVar6 == 1) {
      uVar17 = iVar4 * uVar3;
      iVar2 = pMVar7[1].dims;
      if (uVar1 == 1) {
        if (iVar2 == 1) {
          pAVar11 = opt->blob_allocator;
          if ((((this_00->dims == 1) && (this_00->w == uVar3)) && (this_00->elemsize == sVar8)) &&
             (this_00->allocator == pAVar11)) {
            pvVar15 = this_00->data;
            if (pvVar15 == (void *)0x0) {
              return -100;
            }
          }
          else {
            piVar13 = this_00->refcount;
            if (piVar13 != (int *)0x0) {
              LOCK();
              *piVar13 = *piVar13 + -1;
              UNLOCK();
              if (*piVar13 == 0) {
                if (this_00->allocator == (Allocator *)0x0) {
                  if (this_00->data != (void *)0x0) {
                    free(*(void **)((long)this_00->data + -8));
                  }
                }
                else {
                  (**(code **)(*(long *)this_00->allocator + 8))();
                }
              }
            }
            this_00->data = (void *)0x0;
            this_00->refcount = (int *)0x0;
            this_00->elemsize = sVar8;
            this_00->allocator = pAVar11;
            this_00->dims = 1;
            this_00->w = uVar3;
            this_00->h = 1;
            this_00->c = 1;
            this_00->cstep = sVar28;
            if (uVar3 == 0) {
              return -100;
            }
            uVar21 = sVar8 * sVar28 + 3 & 0xfffffffffffffffc;
            if (pAVar11 == (Allocator *)0x0) {
              pvVar16 = malloc(uVar21 + 0x1c);
              pvVar15 = (void *)((long)pvVar16 + 0x17U & 0xfffffffffffffff0);
              *(void **)((long)pvVar15 + -8) = pvVar16;
            }
            else {
              pvVar15 = (void *)(*(code *)**(undefined8 **)pAVar11)(pAVar11);
            }
            this_00->data = pvVar15;
            this_00->refcount = (int *)((long)pvVar15 + uVar21);
            *(undefined4 *)((long)pvVar15 + uVar21) = 1;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar17 < 1) {
            return 0;
          }
          fVar30 = *pMVar7->data;
          pvVar16 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar30 - *(float *)((long)pvVar16 + uVar21 * 4)
            ;
            uVar21 = uVar21 + 1;
          } while (uVar17 != uVar21);
        }
        else if (iVar2 == 2) {
          Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar17 < 1) {
            return 0;
          }
          fVar30 = *pMVar7->data;
          pvVar16 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar30 - *(float *)((long)pvVar16 + uVar21 * 4)
            ;
            uVar21 = uVar21 + 1;
          } while (uVar17 != uVar21);
        }
        else if (iVar2 == 3) {
          Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar5) {
              fVar30 = *pMVar7->data;
              pvVar16 = pMVar7[1].data;
              sVar27 = pMVar7[1].elemsize;
              sVar28 = this_00->elemsize;
              sVar9 = pMVar7[1].cstep;
              uVar23 = 0;
              do {
                if (0 < (int)uVar17) {
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         fVar30 - *(float *)((long)pvVar16 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar17 != uVar19);
                }
                uVar23 = uVar23 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
                pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
              } while (uVar23 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else if (iVar2 == 1) {
        pAVar11 = opt->blob_allocator;
        if (((this_00->dims == 1) && (this_00->w == uVar1)) &&
           ((this_00->elemsize == sVar8 && (this_00->allocator == pAVar11)))) {
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
        }
        else {
          piVar13 = this_00->refcount;
          if (piVar13 != (int *)0x0) {
            LOCK();
            *piVar13 = *piVar13 + -1;
            UNLOCK();
            if (*piVar13 == 0) {
              if (this_00->allocator == (Allocator *)0x0) {
                if (this_00->data != (void *)0x0) {
                  free(*(void **)((long)this_00->data + -8));
                }
              }
              else {
                (**(code **)(*(long *)this_00->allocator + 8))();
              }
            }
          }
          this_00->data = (void *)0x0;
          this_00->refcount = (int *)0x0;
          this_00->elemsize = sVar8;
          this_00->allocator = pAVar11;
          this_00->dims = 1;
          this_00->w = uVar1;
          this_00->h = 1;
          this_00->c = 1;
          this_00->cstep = sVar27;
          if (uVar1 == 0) {
            return -100;
          }
          uVar21 = sVar8 * sVar27 + 3 & 0xfffffffffffffffc;
          if (pAVar11 == (Allocator *)0x0) {
            pvVar16 = malloc(uVar21 + 0x1c);
            pvVar15 = (void *)((long)pvVar16 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar15 + -8) = pvVar16;
          }
          else {
            pvVar15 = (void *)(*(code *)**(undefined8 **)pAVar11)();
          }
          this_00->data = pvVar15;
          this_00->refcount = (int *)((long)pvVar15 + uVar21);
          *(undefined4 *)((long)pvVar15 + uVar21) = 1;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w == 1) {
          if ((int)uVar14 < 1) {
            return 0;
          }
          fVar30 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = *(float *)((long)pvVar16 + uVar21 * 4) - fVar30
            ;
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
        }
        else {
          if ((int)uVar14 < 1) {
            return 0;
          }
          pvVar16 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) =
                 *(float *)((long)pvVar16 + uVar21 * 4) - *(float *)((long)pvVar22 + uVar21 * 4);
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
        }
      }
      else {
        if (iVar2 == 2) {
          Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar4) {
              pvVar16 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              lVar18 = 0;
              do {
                if (0 < (int)uVar3) {
                  fVar30 = *(float *)((long)pvVar16 + lVar18 * 4);
                  uVar21 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar21 * 4) =
                         fVar30 - *(float *)((long)pvVar22 + uVar21 * 4);
                    uVar21 = uVar21 + 1;
                  } while (uVar3 != uVar21);
                }
                lVar18 = lVar18 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar28 * 4);
                pvVar22 = (void *)((long)pvVar22 + sVar28 * 4);
              } while (lVar18 != lVar26);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar2 == 3) {
          Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar5) {
              pvVar16 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              sVar27 = pMVar7[1].elemsize;
              sVar28 = this_00->elemsize;
              sVar9 = pMVar7[1].cstep;
              uVar23 = 0;
              do {
                if (0 < (int)uVar17) {
                  fVar30 = *(float *)((long)pvVar16 + uVar23 * 4);
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         fVar30 - *(float *)((long)pvVar22 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar17 != uVar19);
                }
                uVar23 = uVar23 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
                pvVar22 = (void *)((long)pvVar22 + sVar27 * sVar9);
              } while (uVar23 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
    }
    else if (iVar6 == 2) {
      if (pMVar7[1].dims == 3) {
        Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 != 0) {
          if (0 < (int)uVar5) {
            pvVar16 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            sVar27 = pMVar7[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = pMVar7[1].cstep;
            uVar23 = 0;
            do {
              if (0 < iVar4) {
                lVar18 = 0;
                pvVar24 = pvVar22;
                pvVar25 = pvVar15;
                do {
                  if (0 < (int)uVar3) {
                    fVar30 = *(float *)((long)pvVar16 + lVar18 * 4 + uVar23 * lVar26 * 4);
                    uVar19 = 0;
                    do {
                      *(float *)((long)pvVar25 + uVar19 * 4) =
                           fVar30 - *(float *)((long)pvVar24 + uVar19 * 4);
                      uVar19 = uVar19 + 1;
                    } while (uVar3 != uVar19);
                  }
                  lVar18 = lVar18 + 1;
                  pvVar25 = (void *)((long)pvVar25 + sVar28 * 4);
                  pvVar24 = (void *)((long)pvVar24 + sVar28 * 4);
                } while (lVar18 != lVar26);
              }
              uVar23 = uVar23 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar27 * sVar10);
            } while (uVar23 != uVar21);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar7[1].dims == 1) {
        Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w != 1) {
          if (0 < iVar2) {
            pvVar16 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            lVar26 = 0;
            do {
              if (0 < (int)uVar1) {
                fVar30 = *(float *)((long)pvVar22 + lVar26 * 4);
                uVar21 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar21 * 4) =
                       *(float *)((long)pvVar16 + uVar21 * 4) - fVar30;
                  uVar21 = uVar21 + 1;
                } while (uVar1 != uVar21);
              }
              lVar26 = lVar26 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar27 * 4);
              pvVar16 = (void *)((long)pvVar16 + sVar27 * 4);
            } while (lVar26 != lVar18);
            return 0;
          }
          return 0;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        fVar30 = *pMVar7[1].data;
        pvVar16 = pMVar7->data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar15 + uVar21 * 4) = *(float *)((long)pvVar16 + uVar21 * 4) - fVar30;
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
      }
      else if (pMVar7[1].dims == 2) {
        if ((int)uVar14 < 1) {
          return 0;
        }
        pvVar16 = pMVar7->data;
        pvVar22 = pMVar7[1].data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar15 + uVar21 * 4) =
               *(float *)((long)pvVar16 + uVar21 * 4) - *(float *)((long)pvVar22 + uVar21 * 4);
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
      }
    }
    else if (iVar6 == 3) {
      uVar3 = pMVar7->c;
      uVar21 = (ulong)uVar3;
      Mat::create(this_00,uVar1,iVar2,uVar3,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      iVar4 = pMVar7[1].dims;
      if (iVar4 == 1) {
        if (pMVar7[1].w != 1) {
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar27 = pMVar7->elemsize;
            pvVar22 = pMVar7[1].data;
            sVar28 = this_00->elemsize;
            sVar9 = pMVar7->cstep;
            uVar23 = 0;
            do {
              if (0 < (int)uVar14) {
                fVar30 = *(float *)((long)pvVar22 + uVar23 * 4);
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar19 * 4) =
                       *(float *)((long)pvVar16 + uVar19 * 4) - fVar30;
                  uVar19 = uVar19 + 1;
                } while (uVar14 != uVar19);
              }
              uVar23 = uVar23 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
              pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
            } while (uVar23 != uVar21);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar3) {
          fVar30 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          sVar27 = pMVar7->elemsize;
          sVar28 = this_00->elemsize;
          sVar9 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar19 = 0;
              do {
                *(float *)((long)pvVar15 + uVar19 * 4) =
                     *(float *)((long)pvVar16 + uVar19 * 4) - fVar30;
                uVar19 = uVar19 + 1;
              } while (uVar14 != uVar19);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
            pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
          } while (uVar23 != uVar21);
          return 0;
        }
        return 0;
      }
      if (iVar4 == 3) {
        if (0 < (int)uVar3) {
          pvVar16 = pMVar7->data;
          sVar27 = pMVar7->elemsize;
          pvVar22 = pMVar7[1].data;
          sVar28 = pMVar7[1].elemsize;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar7[1].cstep;
          sVar12 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar19 = 0;
              do {
                *(float *)((long)pvVar15 + uVar19 * 4) =
                     *(float *)((long)pvVar16 + uVar19 * 4) - *(float *)((long)pvVar22 + uVar19 * 4)
                ;
                uVar19 = uVar19 + 1;
              } while (uVar14 != uVar19);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
            pvVar22 = (void *)((long)pvVar22 + sVar28 * sVar10);
            pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar12);
          } while (uVar23 != uVar21);
          return 0;
        }
        return 0;
      }
      if (iVar4 == 2) {
        if (0 < (int)uVar3) {
          pvVar16 = pMVar7->data;
          sVar28 = pMVar7->elemsize;
          pvVar22 = pMVar7[1].data;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < iVar2) {
              lVar26 = 0;
              pvVar24 = pvVar16;
              pvVar25 = pvVar15;
              do {
                if (0 < (int)uVar1) {
                  fVar30 = *(float *)((long)pvVar22 + lVar26 * 4 + uVar23 * lVar18 * 4);
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar25 + uVar19 * 4) =
                         *(float *)((long)pvVar24 + uVar19 * 4) - fVar30;
                    uVar19 = uVar19 + 1;
                  } while (uVar1 != uVar19);
                }
                lVar26 = lVar26 + 1;
                pvVar25 = (void *)((long)pvVar25 + sVar27 * 4);
                pvVar24 = (void *)((long)pvVar24 + sVar27 * 4);
              } while (lVar26 != lVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
            pvVar16 = (void *)((long)pvVar16 + sVar28 * sVar10);
          } while (uVar23 != uVar21);
          return 0;
        }
        return 0;
      }
    }
    break;
  case 2:
    uVar1 = pMVar7->w;
    sVar27 = (size_t)(int)uVar1;
    iVar2 = pMVar7->h;
    lVar18 = (long)iVar2;
    uVar14 = iVar2 * uVar1;
    sVar8 = pMVar7->elemsize;
    uVar3 = pMVar7[1].w;
    sVar28 = (size_t)(int)uVar3;
    iVar4 = pMVar7[1].h;
    lVar26 = (long)iVar4;
    uVar5 = pMVar7[1].c;
    uVar21 = (ulong)uVar5;
    iVar6 = pMVar7->dims;
    if (iVar6 == 1) {
      uVar17 = iVar4 * uVar3;
      iVar2 = pMVar7[1].dims;
      if (uVar1 == 1) {
        if (iVar2 == 1) {
          pAVar11 = opt->blob_allocator;
          if (((this_00->dims == 1) && (this_00->w == uVar3)) &&
             ((this_00->elemsize == sVar8 && (this_00->allocator == pAVar11)))) {
            pvVar15 = this_00->data;
            if (pvVar15 == (void *)0x0) {
              return -100;
            }
          }
          else {
            piVar13 = this_00->refcount;
            if (piVar13 != (int *)0x0) {
              LOCK();
              *piVar13 = *piVar13 + -1;
              UNLOCK();
              if (*piVar13 == 0) {
                if (this_00->allocator == (Allocator *)0x0) {
                  if (this_00->data != (void *)0x0) {
                    free(*(void **)((long)this_00->data + -8));
                  }
                }
                else {
                  (**(code **)(*(long *)this_00->allocator + 8))();
                }
              }
            }
            this_00->data = (void *)0x0;
            this_00->refcount = (int *)0x0;
            this_00->elemsize = sVar8;
            this_00->allocator = pAVar11;
            this_00->dims = 1;
            this_00->w = uVar3;
            this_00->h = 1;
            this_00->c = 1;
            this_00->cstep = sVar28;
            if (uVar3 == 0) {
              return -100;
            }
            uVar21 = sVar8 * sVar28 + 3 & 0xfffffffffffffffc;
            if (pAVar11 == (Allocator *)0x0) {
              pvVar16 = malloc(uVar21 + 0x1c);
              pvVar15 = (void *)((long)pvVar16 + 0x17U & 0xfffffffffffffff0);
              *(void **)((long)pvVar15 + -8) = pvVar16;
            }
            else {
              pvVar15 = (void *)(*(code *)**(undefined8 **)pAVar11)(pAVar11);
            }
            this_00->data = pvVar15;
            this_00->refcount = (int *)((long)pvVar15 + uVar21);
            *(undefined4 *)((long)pvVar15 + uVar21) = 1;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar17 < 1) {
            return 0;
          }
          fVar30 = *pMVar7->data;
          pvVar16 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = *(float *)((long)pvVar16 + uVar21 * 4) * fVar30
            ;
            uVar21 = uVar21 + 1;
          } while (uVar17 != uVar21);
        }
        else if (iVar2 == 2) {
          Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar17 < 1) {
            return 0;
          }
          fVar30 = *pMVar7->data;
          pvVar16 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = *(float *)((long)pvVar16 + uVar21 * 4) * fVar30
            ;
            uVar21 = uVar21 + 1;
          } while (uVar17 != uVar21);
        }
        else if (iVar2 == 3) {
          Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar5) {
              fVar30 = *pMVar7->data;
              pvVar16 = pMVar7[1].data;
              sVar27 = pMVar7[1].elemsize;
              sVar28 = this_00->elemsize;
              sVar9 = pMVar7[1].cstep;
              uVar23 = 0;
              do {
                if (0 < (int)uVar17) {
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar16 + uVar19 * 4) * fVar30;
                    uVar19 = uVar19 + 1;
                  } while (uVar17 != uVar19);
                }
                uVar23 = uVar23 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
                pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
              } while (uVar23 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else if (iVar2 == 1) {
        pAVar11 = opt->blob_allocator;
        if ((((this_00->dims == 1) && (this_00->w == uVar1)) && (this_00->elemsize == sVar8)) &&
           (this_00->allocator == pAVar11)) {
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
        }
        else {
          piVar13 = this_00->refcount;
          if (piVar13 != (int *)0x0) {
            LOCK();
            *piVar13 = *piVar13 + -1;
            UNLOCK();
            if (*piVar13 == 0) {
              if (this_00->allocator == (Allocator *)0x0) {
                if (this_00->data != (void *)0x0) {
                  free(*(void **)((long)this_00->data + -8));
                }
              }
              else {
                (**(code **)(*(long *)this_00->allocator + 8))();
              }
            }
          }
          this_00->data = (void *)0x0;
          this_00->refcount = (int *)0x0;
          this_00->elemsize = sVar8;
          this_00->allocator = pAVar11;
          this_00->dims = 1;
          this_00->w = uVar1;
          this_00->h = 1;
          this_00->c = 1;
          this_00->cstep = sVar27;
          if (uVar1 == 0) {
            return -100;
          }
          uVar21 = sVar8 * sVar27 + 3 & 0xfffffffffffffffc;
          if (pAVar11 == (Allocator *)0x0) {
            pvVar16 = malloc(uVar21 + 0x1c);
            pvVar15 = (void *)((long)pvVar16 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar15 + -8) = pvVar16;
          }
          else {
            pvVar15 = (void *)(*(code *)**(undefined8 **)pAVar11)();
          }
          this_00->data = pvVar15;
          this_00->refcount = (int *)((long)pvVar15 + uVar21);
          *(undefined4 *)((long)pvVar15 + uVar21) = 1;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w == 1) {
          if ((int)uVar14 < 1) {
            return 0;
          }
          fVar30 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = *(float *)((long)pvVar16 + uVar21 * 4) * fVar30
            ;
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
        }
        else {
          if ((int)uVar14 < 1) {
            return 0;
          }
          pvVar16 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) =
                 *(float *)((long)pvVar22 + uVar21 * 4) * *(float *)((long)pvVar16 + uVar21 * 4);
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
        }
      }
      else {
        if (iVar2 == 2) {
          Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar4) {
              pvVar16 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              lVar18 = 0;
              do {
                if (0 < (int)uVar3) {
                  fVar30 = *(float *)((long)pvVar16 + lVar18 * 4);
                  uVar21 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar21 * 4) =
                         *(float *)((long)pvVar22 + uVar21 * 4) * fVar30;
                    uVar21 = uVar21 + 1;
                  } while (uVar3 != uVar21);
                }
                lVar18 = lVar18 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar28 * 4);
                pvVar22 = (void *)((long)pvVar22 + sVar28 * 4);
              } while (lVar18 != lVar26);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar2 == 3) {
          Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar5) {
              pvVar16 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              sVar27 = pMVar7[1].elemsize;
              sVar28 = this_00->elemsize;
              sVar9 = pMVar7[1].cstep;
              uVar23 = 0;
              do {
                if (0 < (int)uVar17) {
                  fVar30 = *(float *)((long)pvVar16 + uVar23 * 4);
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar22 + uVar19 * 4) * fVar30;
                    uVar19 = uVar19 + 1;
                  } while (uVar17 != uVar19);
                }
                uVar23 = uVar23 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
                pvVar22 = (void *)((long)pvVar22 + sVar27 * sVar9);
              } while (uVar23 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
    }
    else if (iVar6 == 2) {
      if (pMVar7[1].dims == 3) {
        Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 != 0) {
          if (0 < (int)uVar5) {
            pvVar16 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            sVar27 = pMVar7[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = pMVar7[1].cstep;
            uVar23 = 0;
            do {
              if (0 < iVar4) {
                lVar18 = 0;
                pvVar24 = pvVar22;
                pvVar25 = pvVar15;
                do {
                  if (0 < (int)uVar3) {
                    fVar30 = *(float *)((long)pvVar16 + lVar18 * 4 + uVar23 * lVar26 * 4);
                    uVar19 = 0;
                    do {
                      *(float *)((long)pvVar25 + uVar19 * 4) =
                           *(float *)((long)pvVar24 + uVar19 * 4) * fVar30;
                      uVar19 = uVar19 + 1;
                    } while (uVar3 != uVar19);
                  }
                  lVar18 = lVar18 + 1;
                  pvVar25 = (void *)((long)pvVar25 + sVar28 * 4);
                  pvVar24 = (void *)((long)pvVar24 + sVar28 * 4);
                } while (lVar18 != lVar26);
              }
              uVar23 = uVar23 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar27 * sVar10);
            } while (uVar23 != uVar21);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar7[1].dims == 1) {
        Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w != 1) {
          if (0 < iVar2) {
            pvVar16 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            lVar26 = 0;
            do {
              if (0 < (int)uVar1) {
                fVar30 = *(float *)((long)pvVar22 + lVar26 * 4);
                uVar21 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar21 * 4) =
                       *(float *)((long)pvVar16 + uVar21 * 4) * fVar30;
                  uVar21 = uVar21 + 1;
                } while (uVar1 != uVar21);
              }
              lVar26 = lVar26 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar27 * 4);
              pvVar16 = (void *)((long)pvVar16 + sVar27 * 4);
            } while (lVar26 != lVar18);
            return 0;
          }
          return 0;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        fVar30 = *pMVar7[1].data;
        pvVar16 = pMVar7->data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar15 + uVar21 * 4) = *(float *)((long)pvVar16 + uVar21 * 4) * fVar30;
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
      }
      else if (pMVar7[1].dims == 2) {
        if ((int)uVar14 < 1) {
          return 0;
        }
        pvVar16 = pMVar7->data;
        pvVar22 = pMVar7[1].data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar15 + uVar21 * 4) =
               *(float *)((long)pvVar22 + uVar21 * 4) * *(float *)((long)pvVar16 + uVar21 * 4);
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
      }
    }
    else if (iVar6 == 3) {
      uVar3 = pMVar7->c;
      uVar21 = (ulong)uVar3;
      Mat::create(this_00,uVar1,iVar2,uVar3,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      iVar4 = pMVar7[1].dims;
      if (iVar4 == 1) {
        if (pMVar7[1].w != 1) {
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar27 = pMVar7->elemsize;
            pvVar22 = pMVar7[1].data;
            sVar28 = this_00->elemsize;
            sVar9 = pMVar7->cstep;
            uVar23 = 0;
            do {
              if (0 < (int)uVar14) {
                fVar30 = *(float *)((long)pvVar22 + uVar23 * 4);
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar19 * 4) =
                       *(float *)((long)pvVar16 + uVar19 * 4) * fVar30;
                  uVar19 = uVar19 + 1;
                } while (uVar14 != uVar19);
              }
              uVar23 = uVar23 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
              pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
            } while (uVar23 != uVar21);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar3) {
          fVar30 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          sVar27 = pMVar7->elemsize;
          sVar28 = this_00->elemsize;
          sVar9 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar19 = 0;
              do {
                *(float *)((long)pvVar15 + uVar19 * 4) =
                     *(float *)((long)pvVar16 + uVar19 * 4) * fVar30;
                uVar19 = uVar19 + 1;
              } while (uVar14 != uVar19);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
            pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
          } while (uVar23 != uVar21);
          return 0;
        }
        return 0;
      }
      if (iVar4 == 3) {
        if (0 < (int)uVar3) {
          pvVar16 = pMVar7->data;
          sVar27 = pMVar7->elemsize;
          pvVar22 = pMVar7[1].data;
          sVar28 = pMVar7[1].elemsize;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar7[1].cstep;
          sVar12 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar19 = 0;
              do {
                *(float *)((long)pvVar15 + uVar19 * 4) =
                     *(float *)((long)pvVar22 + uVar19 * 4) * *(float *)((long)pvVar16 + uVar19 * 4)
                ;
                uVar19 = uVar19 + 1;
              } while (uVar14 != uVar19);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
            pvVar22 = (void *)((long)pvVar22 + sVar28 * sVar10);
            pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar12);
          } while (uVar23 != uVar21);
          return 0;
        }
        return 0;
      }
      if (iVar4 == 2) {
        if (0 < (int)uVar3) {
          pvVar16 = pMVar7->data;
          sVar28 = pMVar7->elemsize;
          pvVar22 = pMVar7[1].data;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < iVar2) {
              lVar26 = 0;
              pvVar24 = pvVar16;
              pvVar25 = pvVar15;
              do {
                if (0 < (int)uVar1) {
                  fVar30 = *(float *)((long)pvVar22 + lVar26 * 4 + uVar23 * lVar18 * 4);
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar25 + uVar19 * 4) =
                         *(float *)((long)pvVar24 + uVar19 * 4) * fVar30;
                    uVar19 = uVar19 + 1;
                  } while (uVar1 != uVar19);
                }
                lVar26 = lVar26 + 1;
                pvVar25 = (void *)((long)pvVar25 + sVar27 * 4);
                pvVar24 = (void *)((long)pvVar24 + sVar27 * 4);
              } while (lVar26 != lVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
            pvVar16 = (void *)((long)pvVar16 + sVar28 * sVar10);
          } while (uVar23 != uVar21);
          return 0;
        }
        return 0;
      }
    }
    break;
  case 3:
    uVar1 = pMVar7->w;
    sVar27 = (size_t)(int)uVar1;
    iVar2 = pMVar7->h;
    lVar26 = (long)iVar2;
    uVar14 = iVar2 * uVar1;
    sVar8 = pMVar7->elemsize;
    uVar3 = pMVar7[1].w;
    sVar28 = (size_t)(int)uVar3;
    iVar4 = pMVar7[1].h;
    lVar18 = (long)iVar4;
    uVar5 = pMVar7[1].c;
    uVar21 = (ulong)uVar5;
    iVar6 = pMVar7->dims;
    if (iVar6 != 1) {
      if (iVar6 != 2) {
        if (iVar6 != 3) {
          return 0;
        }
        uVar3 = pMVar7->c;
        uVar21 = (ulong)uVar3;
        Mat::create(this_00,uVar1,iVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        iVar4 = pMVar7[1].dims;
        if (iVar4 != 1) {
          if (iVar4 == 3) {
            if (0 < (int)uVar3) {
              pvVar16 = pMVar7->data;
              sVar27 = pMVar7->elemsize;
              pvVar22 = pMVar7[1].data;
              sVar28 = pMVar7[1].elemsize;
              sVar9 = this_00->elemsize;
              sVar10 = pMVar7[1].cstep;
              sVar12 = pMVar7->cstep;
              uVar23 = 0;
              do {
                if (0 < (int)uVar14) {
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar16 + uVar19 * 4) /
                         *(float *)((long)pvVar22 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar14 != uVar19);
                }
                uVar23 = uVar23 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
                pvVar22 = (void *)((long)pvVar22 + sVar28 * sVar10);
                pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar12);
              } while (uVar23 != uVar21);
              return 0;
            }
            return 0;
          }
          if (iVar4 != 2) {
            return 0;
          }
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar28 = pMVar7->elemsize;
            pvVar22 = pMVar7[1].data;
            sVar9 = this_00->elemsize;
            sVar10 = pMVar7->cstep;
            uVar23 = 0;
            do {
              if (0 < iVar2) {
                lVar18 = 0;
                pvVar24 = pvVar16;
                pvVar25 = pvVar15;
                do {
                  if (0 < (int)uVar1) {
                    fVar30 = *(float *)((long)pvVar22 + lVar18 * 4 + uVar23 * lVar26 * 4);
                    uVar19 = 0;
                    do {
                      *(float *)((long)pvVar25 + uVar19 * 4) =
                           *(float *)((long)pvVar24 + uVar19 * 4) * (1.0 / fVar30);
                      uVar19 = uVar19 + 1;
                    } while (uVar1 != uVar19);
                  }
                  lVar18 = lVar18 + 1;
                  pvVar25 = (void *)((long)pvVar25 + sVar27 * 4);
                  pvVar24 = (void *)((long)pvVar24 + sVar27 * 4);
                } while (lVar18 != lVar26);
              }
              uVar23 = uVar23 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
              pvVar16 = (void *)((long)pvVar16 + sVar28 * sVar10);
            } while (uVar23 != uVar21);
            return 0;
          }
          return 0;
        }
        if (pMVar7[1].w != 1) {
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar27 = pMVar7->elemsize;
            pvVar22 = pMVar7[1].data;
            sVar28 = this_00->elemsize;
            sVar9 = pMVar7->cstep;
            uVar23 = 0;
            do {
              if (0 < (int)uVar14) {
                fVar30 = *(float *)((long)pvVar22 + uVar23 * 4);
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar19 * 4) =
                       *(float *)((long)pvVar16 + uVar19 * 4) * (1.0 / fVar30);
                  uVar19 = uVar19 + 1;
                } while (uVar14 != uVar19);
              }
              uVar23 = uVar23 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
              pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
            } while (uVar23 != uVar21);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar3) {
          pvVar16 = pMVar7->data;
          sVar27 = this_00->elemsize;
          sVar28 = pMVar7->elemsize;
          fVar30 = *pMVar7[1].data;
          sVar9 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar19 = 0;
              do {
                *(float *)((long)pvVar15 + uVar19 * 4) =
                     *(float *)((long)pvVar16 + uVar19 * 4) * (1.0 / fVar30);
                uVar19 = uVar19 + 1;
              } while (uVar14 != uVar19);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar27);
            pvVar16 = (void *)((long)pvVar16 + sVar28 * sVar9);
          } while (uVar23 != uVar21);
          return 0;
        }
        return 0;
      }
      if (pMVar7[1].dims == 3) {
        Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 != 0) {
          if (0 < (int)uVar5) {
            pvVar16 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            sVar27 = pMVar7[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = pMVar7[1].cstep;
            uVar23 = 0;
            do {
              if (0 < iVar4) {
                lVar26 = 0;
                pvVar24 = pvVar22;
                pvVar25 = pvVar15;
                do {
                  if (0 < (int)uVar3) {
                    fVar30 = *(float *)((long)pvVar16 + lVar26 * 4 + uVar23 * lVar18 * 4);
                    uVar19 = 0;
                    do {
                      *(float *)((long)pvVar25 + uVar19 * 4) =
                           fVar30 / *(float *)((long)pvVar24 + uVar19 * 4);
                      uVar19 = uVar19 + 1;
                    } while (uVar3 != uVar19);
                  }
                  lVar26 = lVar26 + 1;
                  pvVar25 = (void *)((long)pvVar25 + sVar28 * 4);
                  pvVar24 = (void *)((long)pvVar24 + sVar28 * 4);
                } while (lVar26 != lVar18);
              }
              uVar23 = uVar23 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar27 * sVar10);
            } while (uVar23 != uVar21);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar7[1].dims != 1) {
        if (pMVar7[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar14) {
          pvVar16 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) =
                 *(float *)((long)pvVar16 + uVar21 * 4) / *(float *)((long)pvVar22 + uVar21 * 4);
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
          return 0;
        }
        return 0;
      }
      Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (pMVar7[1].w != 1) {
          if (0 < iVar2) {
            pvVar16 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            lVar18 = 0;
            do {
              if (0 < (int)uVar1) {
                fVar30 = *(float *)((long)pvVar22 + lVar18 * 4);
                uVar21 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar21 * 4) =
                       *(float *)((long)pvVar16 + uVar21 * 4) * (1.0 / fVar30);
                  uVar21 = uVar21 + 1;
                } while (uVar1 != uVar21);
              }
              lVar18 = lVar18 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar27 * 4);
              pvVar16 = (void *)((long)pvVar16 + sVar27 * 4);
            } while (lVar18 != lVar26);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar14) {
          pvVar16 = pMVar7->data;
          fVar30 = *pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) =
                 *(float *)((long)pvVar16 + uVar21 * 4) * (1.0 / fVar30);
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    uVar17 = iVar4 * uVar3;
    iVar2 = pMVar7[1].dims;
    if (uVar1 == 1) {
      if (iVar2 == 1) {
        pAVar11 = opt->blob_allocator;
        if (((this_00->dims == 1) && (this_00->w == uVar3)) &&
           ((this_00->elemsize == sVar8 && (this_00->allocator == pAVar11)))) {
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
        }
        else {
          piVar13 = this_00->refcount;
          if (piVar13 != (int *)0x0) {
            LOCK();
            *piVar13 = *piVar13 + -1;
            UNLOCK();
            if (*piVar13 == 0) {
              if (this_00->allocator == (Allocator *)0x0) {
                if (this_00->data != (void *)0x0) {
                  free(*(void **)((long)this_00->data + -8));
                }
              }
              else {
                (**(code **)(*(long *)this_00->allocator + 8))();
              }
            }
          }
          this_00->data = (void *)0x0;
          this_00->refcount = (int *)0x0;
          this_00->elemsize = sVar8;
          this_00->allocator = pAVar11;
          this_00->dims = 1;
          this_00->w = uVar3;
          this_00->h = 1;
          this_00->c = 1;
          this_00->cstep = sVar28;
          if (uVar3 == 0) {
            return -100;
          }
          uVar21 = sVar8 * sVar28 + 3 & 0xfffffffffffffffc;
          if (pAVar11 == (Allocator *)0x0) {
            pvVar16 = malloc(uVar21 + 0x1c);
            pvVar15 = (void *)((long)pvVar16 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar15 + -8) = pvVar16;
          }
          else {
            pvVar15 = (void *)(*(code *)**(undefined8 **)pAVar11)(pAVar11);
          }
          this_00->data = pvVar15;
          this_00->refcount = (int *)((long)pvVar15 + uVar21);
          *(undefined4 *)((long)pvVar15 + uVar21) = 1;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar17) {
          fVar30 = *pMVar7->data;
          pvVar16 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar30 / *(float *)((long)pvVar16 + uVar21 * 4)
            ;
            uVar21 = uVar21 + 1;
          } while (uVar17 != uVar21);
          return 0;
        }
        return 0;
      }
      if (iVar2 == 2) {
        Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar17) {
            fVar30 = *pMVar7->data;
            pvVar16 = pMVar7[1].data;
            uVar21 = 0;
            do {
              *(float *)((long)pvVar15 + uVar21 * 4) =
                   fVar30 / *(float *)((long)pvVar16 + uVar21 * 4);
              uVar21 = uVar21 + 1;
            } while (uVar17 != uVar21);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar2 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 != (void *)0x0) {
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if (0 < (int)uVar5) {
          fVar30 = *pMVar7->data;
          pvVar16 = pMVar7[1].data;
          sVar27 = pMVar7[1].elemsize;
          sVar28 = this_00->elemsize;
          sVar9 = pMVar7[1].cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar17) {
              uVar19 = 0;
              do {
                *(float *)((long)pvVar15 + uVar19 * 4) =
                     fVar30 / *(float *)((long)pvVar16 + uVar19 * 4);
                uVar19 = uVar19 + 1;
              } while (uVar17 != uVar19);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
            pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
          } while (uVar23 != uVar21);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar2 != 1) {
      if (iVar2 == 2) {
        Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < iVar4) {
            pvVar16 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            lVar26 = 0;
            do {
              if (0 < (int)uVar3) {
                fVar30 = *(float *)((long)pvVar16 + lVar26 * 4);
                uVar21 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar21 * 4) =
                       fVar30 / *(float *)((long)pvVar22 + uVar21 * 4);
                  uVar21 = uVar21 + 1;
                } while (uVar3 != uVar21);
              }
              lVar26 = lVar26 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar28 * 4);
              pvVar22 = (void *)((long)pvVar22 + sVar28 * 4);
            } while (lVar26 != lVar18);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar2 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 != (void *)0x0) {
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if (0 < (int)uVar5) {
          pvVar16 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          sVar27 = pMVar7[1].elemsize;
          sVar28 = this_00->elemsize;
          sVar9 = pMVar7[1].cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar17) {
              fVar30 = *(float *)((long)pvVar16 + uVar23 * 4);
              uVar19 = 0;
              do {
                *(float *)((long)pvVar15 + uVar19 * 4) =
                     fVar30 / *(float *)((long)pvVar22 + uVar19 * 4);
                uVar19 = uVar19 + 1;
              } while (uVar17 != uVar19);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
            pvVar22 = (void *)((long)pvVar22 + sVar27 * sVar9);
          } while (uVar23 != uVar21);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    pAVar11 = opt->blob_allocator;
    if (((this_00->dims == 1) && (this_00->w == uVar1)) &&
       ((this_00->elemsize == sVar8 && (this_00->allocator == pAVar11)))) {
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
    }
    else {
      piVar13 = this_00->refcount;
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (this_00->allocator == (Allocator *)0x0) {
            if (this_00->data != (void *)0x0) {
              free(*(void **)((long)this_00->data + -8));
            }
          }
          else {
            (**(code **)(*(long *)this_00->allocator + 8))();
          }
        }
      }
      this_00->data = (void *)0x0;
      this_00->refcount = (int *)0x0;
      this_00->elemsize = sVar8;
      this_00->allocator = pAVar11;
      this_00->dims = 1;
      this_00->w = uVar1;
      this_00->h = 1;
      this_00->c = 1;
      this_00->cstep = sVar27;
      if (uVar1 == 0) {
        return -100;
      }
      uVar21 = sVar8 * sVar27 + 3 & 0xfffffffffffffffc;
      if (pAVar11 == (Allocator *)0x0) {
        pvVar16 = malloc(uVar21 + 0x1c);
        pvVar15 = (void *)((long)pvVar16 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar15 + -8) = pvVar16;
      }
      else {
        pvVar15 = (void *)(*(code *)**(undefined8 **)pAVar11)(pAVar11,uVar21 + 4);
      }
      this_00->data = pvVar15;
      this_00->refcount = (int *)((long)pvVar15 + uVar21);
      *(undefined4 *)((long)pvVar15 + uVar21) = 1;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if (pMVar7[1].w == 1) {
      if ((int)uVar14 < 1) {
        return 0;
      }
      pvVar16 = pMVar7->data;
      fVar30 = *pMVar7[1].data;
      uVar21 = 0;
      do {
        *(float *)((long)pvVar15 + uVar21 * 4) =
             *(float *)((long)pvVar16 + uVar21 * 4) * (1.0 / fVar30);
        uVar21 = uVar21 + 1;
      } while (uVar14 != uVar21);
    }
    else {
      if ((int)uVar14 < 1) {
        return 0;
      }
      pvVar16 = pMVar7->data;
      pvVar22 = pMVar7[1].data;
      uVar21 = 0;
      do {
        *(float *)((long)pvVar15 + uVar21 * 4) =
             *(float *)((long)pvVar16 + uVar21 * 4) / *(float *)((long)pvVar22 + uVar21 * 4);
        uVar21 = uVar21 + 1;
      } while (uVar14 != uVar21);
    }
    break;
  case 4:
    uVar1 = pMVar7->w;
    sVar27 = (size_t)(int)uVar1;
    iVar2 = pMVar7->h;
    lVar18 = (long)iVar2;
    uVar14 = iVar2 * uVar1;
    sVar8 = pMVar7->elemsize;
    uVar3 = pMVar7[1].w;
    sVar28 = (size_t)(int)uVar3;
    iVar4 = pMVar7[1].h;
    lVar26 = (long)iVar4;
    uVar5 = pMVar7[1].c;
    uVar21 = (ulong)uVar5;
    iVar6 = pMVar7->dims;
    if (iVar6 == 1) {
      uVar17 = iVar4 * uVar3;
      iVar2 = pMVar7[1].dims;
      if (uVar1 == 1) {
        if (iVar2 == 1) {
          pAVar11 = opt->blob_allocator;
          if ((((this_00->dims == 1) && (this_00->w == uVar3)) && (this_00->elemsize == sVar8)) &&
             (this_00->allocator == pAVar11)) {
            pvVar15 = this_00->data;
            if (pvVar15 == (void *)0x0) {
              return -100;
            }
          }
          else {
            piVar13 = this_00->refcount;
            if (piVar13 != (int *)0x0) {
              LOCK();
              *piVar13 = *piVar13 + -1;
              UNLOCK();
              if (*piVar13 == 0) {
                if (this_00->allocator == (Allocator *)0x0) {
                  if (this_00->data != (void *)0x0) {
                    free(*(void **)((long)this_00->data + -8));
                  }
                }
                else {
                  (**(code **)(*(long *)this_00->allocator + 8))();
                }
              }
            }
            this_00->data = (void *)0x0;
            this_00->refcount = (int *)0x0;
            this_00->elemsize = sVar8;
            this_00->allocator = pAVar11;
            this_00->dims = 1;
            this_00->w = uVar3;
            this_00->h = 1;
            this_00->c = 1;
            this_00->cstep = sVar28;
            if (uVar3 == 0) {
              return -100;
            }
            uVar21 = sVar8 * sVar28 + 3 & 0xfffffffffffffffc;
            if (pAVar11 == (Allocator *)0x0) {
              pvVar16 = malloc(uVar21 + 0x1c);
              pvVar15 = (void *)((long)pvVar16 + 0x17U & 0xfffffffffffffff0);
              *(void **)((long)pvVar15 + -8) = pvVar16;
            }
            else {
              pvVar15 = (void *)(*(code *)**(undefined8 **)pAVar11)(pAVar11);
            }
            this_00->data = pvVar15;
            this_00->refcount = (int *)((long)pvVar15 + uVar21);
            *(undefined4 *)((long)pvVar15 + uVar21) = 1;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar17 < 1) {
            return 0;
          }
          fVar30 = *pMVar7->data;
          pvVar16 = pMVar7[1].data;
          uVar21 = 0;
          do {
            fVar29 = *(float *)((long)pvVar16 + uVar21 * 4);
            if (fVar29 <= fVar30) {
              fVar29 = fVar30;
            }
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar29;
            uVar21 = uVar21 + 1;
          } while (uVar17 != uVar21);
        }
        else if (iVar2 == 2) {
          Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar17 < 1) {
            return 0;
          }
          fVar30 = *pMVar7->data;
          pvVar16 = pMVar7[1].data;
          uVar21 = 0;
          do {
            fVar29 = *(float *)((long)pvVar16 + uVar21 * 4);
            if (fVar29 <= fVar30) {
              fVar29 = fVar30;
            }
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar29;
            uVar21 = uVar21 + 1;
          } while (uVar17 != uVar21);
        }
        else if (iVar2 == 3) {
          Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar5) {
              fVar30 = *pMVar7->data;
              pvVar16 = pMVar7[1].data;
              sVar27 = pMVar7[1].elemsize;
              sVar28 = this_00->elemsize;
              sVar9 = pMVar7[1].cstep;
              uVar23 = 0;
              do {
                if (0 < (int)uVar17) {
                  uVar19 = 0;
                  do {
                    fVar29 = *(float *)((long)pvVar16 + uVar19 * 4);
                    if (fVar29 <= fVar30) {
                      fVar29 = fVar30;
                    }
                    *(float *)((long)pvVar15 + uVar19 * 4) = fVar29;
                    uVar19 = uVar19 + 1;
                  } while (uVar17 != uVar19);
                }
                uVar23 = uVar23 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
                pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
              } while (uVar23 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else if (iVar2 == 1) {
        pAVar11 = opt->blob_allocator;
        if (((this_00->dims == 1) && (this_00->w == uVar1)) &&
           ((this_00->elemsize == sVar8 && (this_00->allocator == pAVar11)))) {
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
        }
        else {
          piVar13 = this_00->refcount;
          if (piVar13 != (int *)0x0) {
            LOCK();
            *piVar13 = *piVar13 + -1;
            UNLOCK();
            if (*piVar13 == 0) {
              if (this_00->allocator == (Allocator *)0x0) {
                if (this_00->data != (void *)0x0) {
                  free(*(void **)((long)this_00->data + -8));
                }
              }
              else {
                (**(code **)(*(long *)this_00->allocator + 8))();
              }
            }
          }
          this_00->data = (void *)0x0;
          this_00->refcount = (int *)0x0;
          this_00->elemsize = sVar8;
          this_00->allocator = pAVar11;
          this_00->dims = 1;
          this_00->w = uVar1;
          this_00->h = 1;
          this_00->c = 1;
          this_00->cstep = sVar27;
          if (uVar1 == 0) {
            return -100;
          }
          uVar21 = sVar8 * sVar27 + 3 & 0xfffffffffffffffc;
          if (pAVar11 == (Allocator *)0x0) {
            pvVar16 = malloc(uVar21 + 0x1c);
            pvVar15 = (void *)((long)pvVar16 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar15 + -8) = pvVar16;
          }
          else {
            pvVar15 = (void *)(*(code *)**(undefined8 **)pAVar11)();
          }
          this_00->data = pvVar15;
          this_00->refcount = (int *)((long)pvVar15 + uVar21);
          *(undefined4 *)((long)pvVar15 + uVar21) = 1;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w == 1) {
          if ((int)uVar14 < 1) {
            return 0;
          }
          fVar30 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          uVar21 = 0;
          do {
            fVar29 = *(float *)((long)pvVar16 + uVar21 * 4);
            if (fVar29 <= fVar30) {
              fVar29 = fVar30;
            }
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar29;
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
        }
        else {
          if ((int)uVar14 < 1) {
            return 0;
          }
          pvVar16 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          uVar21 = 0;
          do {
            fVar30 = *(float *)((long)pvVar22 + uVar21 * 4);
            fVar29 = *(float *)((long)pvVar16 + uVar21 * 4);
            if (fVar30 <= fVar29) {
              fVar30 = fVar29;
            }
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar30;
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
        }
      }
      else {
        if (iVar2 == 2) {
          Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar4) {
              pvVar16 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              lVar18 = 0;
              do {
                if (0 < (int)uVar3) {
                  fVar30 = *(float *)((long)pvVar16 + lVar18 * 4);
                  uVar21 = 0;
                  do {
                    fVar29 = *(float *)((long)pvVar22 + uVar21 * 4);
                    if (fVar29 <= fVar30) {
                      fVar29 = fVar30;
                    }
                    *(float *)((long)pvVar15 + uVar21 * 4) = fVar29;
                    uVar21 = uVar21 + 1;
                  } while (uVar3 != uVar21);
                }
                lVar18 = lVar18 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar28 * 4);
                pvVar22 = (void *)((long)pvVar22 + sVar28 * 4);
              } while (lVar18 != lVar26);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar2 == 3) {
          Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar5) {
              pvVar16 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              sVar27 = pMVar7[1].elemsize;
              sVar28 = this_00->elemsize;
              sVar9 = pMVar7[1].cstep;
              uVar23 = 0;
              do {
                if (0 < (int)uVar17) {
                  fVar30 = *(float *)((long)pvVar16 + uVar23 * 4);
                  uVar19 = 0;
                  do {
                    fVar29 = *(float *)((long)pvVar22 + uVar19 * 4);
                    if (fVar29 <= fVar30) {
                      fVar29 = fVar30;
                    }
                    *(float *)((long)pvVar15 + uVar19 * 4) = fVar29;
                    uVar19 = uVar19 + 1;
                  } while (uVar17 != uVar19);
                }
                uVar23 = uVar23 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
                pvVar22 = (void *)((long)pvVar22 + sVar27 * sVar9);
              } while (uVar23 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
    }
    else if (iVar6 == 2) {
      if (pMVar7[1].dims == 3) {
        Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 != 0) {
          if (0 < (int)uVar5) {
            pvVar16 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            sVar27 = pMVar7[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = pMVar7[1].cstep;
            uVar23 = 0;
            do {
              if (0 < iVar4) {
                lVar18 = 0;
                pvVar24 = pvVar22;
                pvVar25 = pvVar15;
                do {
                  if (0 < (int)uVar3) {
                    fVar30 = *(float *)((long)pvVar16 + lVar18 * 4 + uVar23 * lVar26 * 4);
                    uVar19 = 0;
                    do {
                      fVar29 = *(float *)((long)pvVar24 + uVar19 * 4);
                      if (fVar29 <= fVar30) {
                        fVar29 = fVar30;
                      }
                      *(float *)((long)pvVar25 + uVar19 * 4) = fVar29;
                      uVar19 = uVar19 + 1;
                    } while (uVar3 != uVar19);
                  }
                  lVar18 = lVar18 + 1;
                  pvVar25 = (void *)((long)pvVar25 + sVar28 * 4);
                  pvVar24 = (void *)((long)pvVar24 + sVar28 * 4);
                } while (lVar18 != lVar26);
              }
              uVar23 = uVar23 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar27 * sVar10);
            } while (uVar23 != uVar21);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar7[1].dims == 1) {
        Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w != 1) {
          if (0 < iVar2) {
            pvVar16 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            lVar26 = 0;
            do {
              if (0 < (int)uVar1) {
                fVar30 = *(float *)((long)pvVar22 + lVar26 * 4);
                uVar21 = 0;
                do {
                  fVar29 = *(float *)((long)pvVar16 + uVar21 * 4);
                  if (fVar29 <= fVar30) {
                    fVar29 = fVar30;
                  }
                  *(float *)((long)pvVar15 + uVar21 * 4) = fVar29;
                  uVar21 = uVar21 + 1;
                } while (uVar1 != uVar21);
              }
              lVar26 = lVar26 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar27 * 4);
              pvVar16 = (void *)((long)pvVar16 + sVar27 * 4);
            } while (lVar26 != lVar18);
            return 0;
          }
          return 0;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        fVar30 = *pMVar7[1].data;
        pvVar16 = pMVar7->data;
        uVar21 = 0;
        do {
          fVar29 = *(float *)((long)pvVar16 + uVar21 * 4);
          if (fVar29 <= fVar30) {
            fVar29 = fVar30;
          }
          *(float *)((long)pvVar15 + uVar21 * 4) = fVar29;
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
      }
      else if (pMVar7[1].dims == 2) {
        if ((int)uVar14 < 1) {
          return 0;
        }
        pvVar16 = pMVar7->data;
        pvVar22 = pMVar7[1].data;
        uVar21 = 0;
        do {
          fVar30 = *(float *)((long)pvVar22 + uVar21 * 4);
          fVar29 = *(float *)((long)pvVar16 + uVar21 * 4);
          if (fVar30 <= fVar29) {
            fVar30 = fVar29;
          }
          *(float *)((long)pvVar15 + uVar21 * 4) = fVar30;
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
      }
    }
    else if (iVar6 == 3) {
      uVar3 = pMVar7->c;
      uVar21 = (ulong)uVar3;
      Mat::create(this_00,uVar1,iVar2,uVar3,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      iVar4 = pMVar7[1].dims;
      if (iVar4 == 1) {
        if (pMVar7[1].w != 1) {
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar27 = pMVar7->elemsize;
            pvVar22 = pMVar7[1].data;
            sVar28 = this_00->elemsize;
            sVar9 = pMVar7->cstep;
            uVar23 = 0;
            do {
              if (0 < (int)uVar14) {
                fVar30 = *(float *)((long)pvVar22 + uVar23 * 4);
                uVar19 = 0;
                do {
                  fVar29 = *(float *)((long)pvVar16 + uVar19 * 4);
                  if (fVar29 <= fVar30) {
                    fVar29 = fVar30;
                  }
                  *(float *)((long)pvVar15 + uVar19 * 4) = fVar29;
                  uVar19 = uVar19 + 1;
                } while (uVar14 != uVar19);
              }
              uVar23 = uVar23 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
              pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
            } while (uVar23 != uVar21);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar3) {
          fVar30 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          sVar27 = pMVar7->elemsize;
          sVar28 = this_00->elemsize;
          sVar9 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar19 = 0;
              do {
                fVar29 = *(float *)((long)pvVar16 + uVar19 * 4);
                if (fVar29 <= fVar30) {
                  fVar29 = fVar30;
                }
                *(float *)((long)pvVar15 + uVar19 * 4) = fVar29;
                uVar19 = uVar19 + 1;
              } while (uVar14 != uVar19);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
            pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
          } while (uVar23 != uVar21);
          return 0;
        }
        return 0;
      }
      if (iVar4 == 3) {
        if (0 < (int)uVar3) {
          pvVar16 = pMVar7->data;
          sVar27 = pMVar7->elemsize;
          pvVar22 = pMVar7[1].data;
          sVar28 = pMVar7[1].elemsize;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar7[1].cstep;
          sVar12 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar19 = 0;
              do {
                fVar30 = *(float *)((long)pvVar22 + uVar19 * 4);
                fVar29 = *(float *)((long)pvVar16 + uVar19 * 4);
                if (fVar30 <= fVar29) {
                  fVar30 = fVar29;
                }
                *(float *)((long)pvVar15 + uVar19 * 4) = fVar30;
                uVar19 = uVar19 + 1;
              } while (uVar14 != uVar19);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
            pvVar22 = (void *)((long)pvVar22 + sVar28 * sVar10);
            pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar12);
          } while (uVar23 != uVar21);
          return 0;
        }
        return 0;
      }
      if (iVar4 == 2) {
        if (0 < (int)uVar3) {
          pvVar16 = pMVar7->data;
          sVar28 = pMVar7->elemsize;
          pvVar22 = pMVar7[1].data;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < iVar2) {
              lVar26 = 0;
              pvVar24 = pvVar16;
              pvVar25 = pvVar15;
              do {
                if (0 < (int)uVar1) {
                  fVar30 = *(float *)((long)pvVar22 + lVar26 * 4 + uVar23 * lVar18 * 4);
                  uVar19 = 0;
                  do {
                    fVar29 = *(float *)((long)pvVar24 + uVar19 * 4);
                    if (fVar29 <= fVar30) {
                      fVar29 = fVar30;
                    }
                    *(float *)((long)pvVar25 + uVar19 * 4) = fVar29;
                    uVar19 = uVar19 + 1;
                  } while (uVar1 != uVar19);
                }
                lVar26 = lVar26 + 1;
                pvVar25 = (void *)((long)pvVar25 + sVar27 * 4);
                pvVar24 = (void *)((long)pvVar24 + sVar27 * 4);
              } while (lVar26 != lVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
            pvVar16 = (void *)((long)pvVar16 + sVar28 * sVar10);
          } while (uVar23 != uVar21);
          return 0;
        }
        return 0;
      }
    }
    break;
  case 5:
    uVar1 = pMVar7->w;
    sVar27 = (size_t)(int)uVar1;
    iVar2 = pMVar7->h;
    lVar18 = (long)iVar2;
    uVar14 = iVar2 * uVar1;
    sVar8 = pMVar7->elemsize;
    uVar3 = pMVar7[1].w;
    sVar28 = (size_t)(int)uVar3;
    iVar4 = pMVar7[1].h;
    lVar26 = (long)iVar4;
    uVar5 = pMVar7[1].c;
    uVar21 = (ulong)uVar5;
    iVar6 = pMVar7->dims;
    if (iVar6 == 1) {
      uVar17 = iVar4 * uVar3;
      iVar2 = pMVar7[1].dims;
      if (uVar1 == 1) {
        if (iVar2 == 1) {
          pAVar11 = opt->blob_allocator;
          if (((this_00->dims == 1) && (this_00->w == uVar3)) &&
             ((this_00->elemsize == sVar8 && (this_00->allocator == pAVar11)))) {
            pvVar15 = this_00->data;
            if (pvVar15 == (void *)0x0) {
              return -100;
            }
          }
          else {
            piVar13 = this_00->refcount;
            if (piVar13 != (int *)0x0) {
              LOCK();
              *piVar13 = *piVar13 + -1;
              UNLOCK();
              if (*piVar13 == 0) {
                if (this_00->allocator == (Allocator *)0x0) {
                  if (this_00->data != (void *)0x0) {
                    free(*(void **)((long)this_00->data + -8));
                  }
                }
                else {
                  (**(code **)(*(long *)this_00->allocator + 8))();
                }
              }
            }
            this_00->data = (void *)0x0;
            this_00->refcount = (int *)0x0;
            this_00->elemsize = sVar8;
            this_00->allocator = pAVar11;
            this_00->dims = 1;
            this_00->w = uVar3;
            this_00->h = 1;
            this_00->c = 1;
            this_00->cstep = sVar28;
            if (uVar3 == 0) {
              return -100;
            }
            uVar21 = sVar8 * sVar28 + 3 & 0xfffffffffffffffc;
            if (pAVar11 == (Allocator *)0x0) {
              pvVar16 = malloc(uVar21 + 0x1c);
              pvVar15 = (void *)((long)pvVar16 + 0x17U & 0xfffffffffffffff0);
              *(void **)((long)pvVar15 + -8) = pvVar16;
            }
            else {
              pvVar15 = (void *)(*(code *)**(undefined8 **)pAVar11)(pAVar11);
            }
            this_00->data = pvVar15;
            this_00->refcount = (int *)((long)pvVar15 + uVar21);
            *(undefined4 *)((long)pvVar15 + uVar21) = 1;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar17 < 1) {
            return 0;
          }
          fVar30 = *pMVar7->data;
          pvVar16 = pMVar7[1].data;
          uVar21 = 0;
          do {
            fVar29 = *(float *)((long)pvVar16 + uVar21 * 4);
            if (fVar30 <= fVar29) {
              fVar29 = fVar30;
            }
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar29;
            uVar21 = uVar21 + 1;
          } while (uVar17 != uVar21);
        }
        else if (iVar2 == 2) {
          Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar17 < 1) {
            return 0;
          }
          fVar30 = *pMVar7->data;
          pvVar16 = pMVar7[1].data;
          uVar21 = 0;
          do {
            fVar29 = *(float *)((long)pvVar16 + uVar21 * 4);
            if (fVar30 <= fVar29) {
              fVar29 = fVar30;
            }
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar29;
            uVar21 = uVar21 + 1;
          } while (uVar17 != uVar21);
        }
        else if (iVar2 == 3) {
          Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar5) {
              fVar30 = *pMVar7->data;
              pvVar16 = pMVar7[1].data;
              sVar27 = pMVar7[1].elemsize;
              sVar28 = this_00->elemsize;
              sVar9 = pMVar7[1].cstep;
              uVar23 = 0;
              do {
                if (0 < (int)uVar17) {
                  uVar19 = 0;
                  do {
                    fVar29 = *(float *)((long)pvVar16 + uVar19 * 4);
                    if (fVar30 <= fVar29) {
                      fVar29 = fVar30;
                    }
                    *(float *)((long)pvVar15 + uVar19 * 4) = fVar29;
                    uVar19 = uVar19 + 1;
                  } while (uVar17 != uVar19);
                }
                uVar23 = uVar23 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
                pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
              } while (uVar23 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else if (iVar2 == 1) {
        pAVar11 = opt->blob_allocator;
        if ((((this_00->dims == 1) && (this_00->w == uVar1)) && (this_00->elemsize == sVar8)) &&
           (this_00->allocator == pAVar11)) {
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
        }
        else {
          piVar13 = this_00->refcount;
          if (piVar13 != (int *)0x0) {
            LOCK();
            *piVar13 = *piVar13 + -1;
            UNLOCK();
            if (*piVar13 == 0) {
              if (this_00->allocator == (Allocator *)0x0) {
                if (this_00->data != (void *)0x0) {
                  free(*(void **)((long)this_00->data + -8));
                }
              }
              else {
                (**(code **)(*(long *)this_00->allocator + 8))();
              }
            }
          }
          this_00->data = (void *)0x0;
          this_00->refcount = (int *)0x0;
          this_00->elemsize = sVar8;
          this_00->allocator = pAVar11;
          this_00->dims = 1;
          this_00->w = uVar1;
          this_00->h = 1;
          this_00->c = 1;
          this_00->cstep = sVar27;
          if (uVar1 == 0) {
            return -100;
          }
          uVar21 = sVar8 * sVar27 + 3 & 0xfffffffffffffffc;
          if (pAVar11 == (Allocator *)0x0) {
            pvVar16 = malloc(uVar21 + 0x1c);
            pvVar15 = (void *)((long)pvVar16 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar15 + -8) = pvVar16;
          }
          else {
            pvVar15 = (void *)(*(code *)**(undefined8 **)pAVar11)();
          }
          this_00->data = pvVar15;
          this_00->refcount = (int *)((long)pvVar15 + uVar21);
          *(undefined4 *)((long)pvVar15 + uVar21) = 1;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w == 1) {
          if ((int)uVar14 < 1) {
            return 0;
          }
          fVar30 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          uVar21 = 0;
          do {
            fVar29 = *(float *)((long)pvVar16 + uVar21 * 4);
            if (fVar30 <= fVar29) {
              fVar29 = fVar30;
            }
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar29;
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
        }
        else {
          if ((int)uVar14 < 1) {
            return 0;
          }
          pvVar16 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          uVar21 = 0;
          do {
            fVar30 = *(float *)((long)pvVar22 + uVar21 * 4);
            fVar29 = *(float *)((long)pvVar16 + uVar21 * 4);
            if (fVar29 <= fVar30) {
              fVar30 = fVar29;
            }
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar30;
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
        }
      }
      else {
        if (iVar2 == 2) {
          Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar4) {
              pvVar16 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              lVar18 = 0;
              do {
                if (0 < (int)uVar3) {
                  fVar30 = *(float *)((long)pvVar16 + lVar18 * 4);
                  uVar21 = 0;
                  do {
                    fVar29 = *(float *)((long)pvVar22 + uVar21 * 4);
                    if (fVar30 <= fVar29) {
                      fVar29 = fVar30;
                    }
                    *(float *)((long)pvVar15 + uVar21 * 4) = fVar29;
                    uVar21 = uVar21 + 1;
                  } while (uVar3 != uVar21);
                }
                lVar18 = lVar18 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar28 * 4);
                pvVar22 = (void *)((long)pvVar22 + sVar28 * 4);
              } while (lVar18 != lVar26);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar2 == 3) {
          Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar5) {
              pvVar16 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              sVar27 = pMVar7[1].elemsize;
              sVar28 = this_00->elemsize;
              sVar9 = pMVar7[1].cstep;
              uVar23 = 0;
              do {
                if (0 < (int)uVar17) {
                  fVar30 = *(float *)((long)pvVar16 + uVar23 * 4);
                  uVar19 = 0;
                  do {
                    fVar29 = *(float *)((long)pvVar22 + uVar19 * 4);
                    if (fVar30 <= fVar29) {
                      fVar29 = fVar30;
                    }
                    *(float *)((long)pvVar15 + uVar19 * 4) = fVar29;
                    uVar19 = uVar19 + 1;
                  } while (uVar17 != uVar19);
                }
                uVar23 = uVar23 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
                pvVar22 = (void *)((long)pvVar22 + sVar27 * sVar9);
              } while (uVar23 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
    }
    else if (iVar6 == 2) {
      if (pMVar7[1].dims == 3) {
        Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 != 0) {
          if (0 < (int)uVar5) {
            pvVar16 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            sVar27 = pMVar7[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = pMVar7[1].cstep;
            uVar23 = 0;
            do {
              if (0 < iVar4) {
                lVar18 = 0;
                pvVar24 = pvVar22;
                pvVar25 = pvVar15;
                do {
                  if (0 < (int)uVar3) {
                    fVar30 = *(float *)((long)pvVar16 + lVar18 * 4 + uVar23 * lVar26 * 4);
                    uVar19 = 0;
                    do {
                      fVar29 = *(float *)((long)pvVar24 + uVar19 * 4);
                      if (fVar30 <= fVar29) {
                        fVar29 = fVar30;
                      }
                      *(float *)((long)pvVar25 + uVar19 * 4) = fVar29;
                      uVar19 = uVar19 + 1;
                    } while (uVar3 != uVar19);
                  }
                  lVar18 = lVar18 + 1;
                  pvVar25 = (void *)((long)pvVar25 + sVar28 * 4);
                  pvVar24 = (void *)((long)pvVar24 + sVar28 * 4);
                } while (lVar18 != lVar26);
              }
              uVar23 = uVar23 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar27 * sVar10);
            } while (uVar23 != uVar21);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar7[1].dims == 1) {
        Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w != 1) {
          if (0 < iVar2) {
            pvVar16 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            lVar26 = 0;
            do {
              if (0 < (int)uVar1) {
                fVar30 = *(float *)((long)pvVar22 + lVar26 * 4);
                uVar21 = 0;
                do {
                  fVar29 = *(float *)((long)pvVar16 + uVar21 * 4);
                  if (fVar30 <= fVar29) {
                    fVar29 = fVar30;
                  }
                  *(float *)((long)pvVar15 + uVar21 * 4) = fVar29;
                  uVar21 = uVar21 + 1;
                } while (uVar1 != uVar21);
              }
              lVar26 = lVar26 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar27 * 4);
              pvVar16 = (void *)((long)pvVar16 + sVar27 * 4);
            } while (lVar26 != lVar18);
            return 0;
          }
          return 0;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        fVar30 = *pMVar7[1].data;
        pvVar16 = pMVar7->data;
        uVar21 = 0;
        do {
          fVar29 = *(float *)((long)pvVar16 + uVar21 * 4);
          if (fVar30 <= fVar29) {
            fVar29 = fVar30;
          }
          *(float *)((long)pvVar15 + uVar21 * 4) = fVar29;
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
      }
      else if (pMVar7[1].dims == 2) {
        if ((int)uVar14 < 1) {
          return 0;
        }
        pvVar16 = pMVar7->data;
        pvVar22 = pMVar7[1].data;
        uVar21 = 0;
        do {
          fVar30 = *(float *)((long)pvVar22 + uVar21 * 4);
          fVar29 = *(float *)((long)pvVar16 + uVar21 * 4);
          if (fVar29 <= fVar30) {
            fVar30 = fVar29;
          }
          *(float *)((long)pvVar15 + uVar21 * 4) = fVar30;
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
      }
    }
    else if (iVar6 == 3) {
      uVar3 = pMVar7->c;
      uVar21 = (ulong)uVar3;
      Mat::create(this_00,uVar1,iVar2,uVar3,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      iVar4 = pMVar7[1].dims;
      if (iVar4 == 1) {
        if (pMVar7[1].w != 1) {
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar27 = pMVar7->elemsize;
            pvVar22 = pMVar7[1].data;
            sVar28 = this_00->elemsize;
            sVar9 = pMVar7->cstep;
            uVar23 = 0;
            do {
              if (0 < (int)uVar14) {
                fVar30 = *(float *)((long)pvVar22 + uVar23 * 4);
                uVar19 = 0;
                do {
                  fVar29 = *(float *)((long)pvVar16 + uVar19 * 4);
                  if (fVar30 <= fVar29) {
                    fVar29 = fVar30;
                  }
                  *(float *)((long)pvVar15 + uVar19 * 4) = fVar29;
                  uVar19 = uVar19 + 1;
                } while (uVar14 != uVar19);
              }
              uVar23 = uVar23 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
              pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
            } while (uVar23 != uVar21);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar3) {
          fVar30 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          sVar27 = pMVar7->elemsize;
          sVar28 = this_00->elemsize;
          sVar9 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar19 = 0;
              do {
                fVar29 = *(float *)((long)pvVar16 + uVar19 * 4);
                if (fVar30 <= fVar29) {
                  fVar29 = fVar30;
                }
                *(float *)((long)pvVar15 + uVar19 * 4) = fVar29;
                uVar19 = uVar19 + 1;
              } while (uVar14 != uVar19);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
            pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
          } while (uVar23 != uVar21);
          return 0;
        }
        return 0;
      }
      if (iVar4 == 3) {
        if (0 < (int)uVar3) {
          pvVar16 = pMVar7->data;
          sVar27 = pMVar7->elemsize;
          pvVar22 = pMVar7[1].data;
          sVar28 = pMVar7[1].elemsize;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar7[1].cstep;
          sVar12 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar19 = 0;
              do {
                fVar30 = *(float *)((long)pvVar22 + uVar19 * 4);
                fVar29 = *(float *)((long)pvVar16 + uVar19 * 4);
                if (fVar29 <= fVar30) {
                  fVar30 = fVar29;
                }
                *(float *)((long)pvVar15 + uVar19 * 4) = fVar30;
                uVar19 = uVar19 + 1;
              } while (uVar14 != uVar19);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
            pvVar22 = (void *)((long)pvVar22 + sVar28 * sVar10);
            pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar12);
          } while (uVar23 != uVar21);
          return 0;
        }
        return 0;
      }
      if (iVar4 == 2) {
        if (0 < (int)uVar3) {
          pvVar16 = pMVar7->data;
          sVar28 = pMVar7->elemsize;
          pvVar22 = pMVar7[1].data;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < iVar2) {
              lVar26 = 0;
              pvVar24 = pvVar16;
              pvVar25 = pvVar15;
              do {
                if (0 < (int)uVar1) {
                  fVar30 = *(float *)((long)pvVar22 + lVar26 * 4 + uVar23 * lVar18 * 4);
                  uVar19 = 0;
                  do {
                    fVar29 = *(float *)((long)pvVar24 + uVar19 * 4);
                    if (fVar30 <= fVar29) {
                      fVar29 = fVar30;
                    }
                    *(float *)((long)pvVar25 + uVar19 * 4) = fVar29;
                    uVar19 = uVar19 + 1;
                  } while (uVar1 != uVar19);
                }
                lVar26 = lVar26 + 1;
                pvVar25 = (void *)((long)pvVar25 + sVar27 * 4);
                pvVar24 = (void *)((long)pvVar24 + sVar27 * 4);
              } while (lVar26 != lVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
            pvVar16 = (void *)((long)pvVar16 + sVar28 * sVar10);
          } while (uVar23 != uVar21);
          return 0;
        }
        return 0;
      }
    }
    break;
  case 6:
    uVar1 = pMVar7->w;
    sVar28 = (size_t)(int)uVar1;
    iVar2 = pMVar7->h;
    lVar26 = (long)iVar2;
    uVar14 = iVar2 * uVar1;
    uVar23 = (ulong)uVar14;
    sVar8 = pMVar7->elemsize;
    uVar3 = pMVar7[1].w;
    sVar27 = (size_t)(int)uVar3;
    iVar4 = pMVar7[1].h;
    lVar18 = (long)iVar4;
    uVar5 = pMVar7[1].c;
    uVar21 = (ulong)uVar5;
    iVar6 = pMVar7->dims;
    if (iVar6 == 1) {
      uVar17 = iVar4 * uVar3;
      iVar2 = pMVar7[1].dims;
      if (uVar1 == 1) {
        if (iVar2 == 1) {
          pAVar11 = opt->blob_allocator;
          if (((this_00->dims == 1) && (this_00->w == uVar3)) &&
             ((this_00->elemsize == sVar8 && (this_00->allocator == pAVar11)))) {
            pvVar15 = this_00->data;
            if (pvVar15 == (void *)0x0) {
              return -100;
            }
          }
          else {
            piVar13 = this_00->refcount;
            if (piVar13 != (int *)0x0) {
              LOCK();
              *piVar13 = *piVar13 + -1;
              UNLOCK();
              if (*piVar13 == 0) {
                if (this_00->allocator == (Allocator *)0x0) {
                  if (this_00->data != (void *)0x0) {
                    free(*(void **)((long)this_00->data + -8));
                  }
                }
                else {
                  (**(code **)(*(long *)this_00->allocator + 8))();
                }
              }
            }
            this_00->data = (void *)0x0;
            this_00->refcount = (int *)0x0;
            this_00->elemsize = sVar8;
            this_00->allocator = pAVar11;
            this_00->dims = 1;
            this_00->w = uVar3;
            this_00->h = 1;
            this_00->c = 1;
            this_00->cstep = sVar27;
            if (uVar3 == 0) {
              return -100;
            }
            uVar21 = sVar8 * sVar27 + 3 & 0xfffffffffffffffc;
            if (pAVar11 == (Allocator *)0x0) {
              pvVar16 = malloc(uVar21 + 0x1c);
              pvVar15 = (void *)((long)pvVar16 + 0x17U & 0xfffffffffffffff0);
              *(void **)((long)pvVar15 + -8) = pvVar16;
            }
            else {
              pvVar15 = (void *)(*(code *)**(undefined8 **)pAVar11)(pAVar11,uVar21 + 4);
            }
            this_00->data = pvVar15;
            this_00->refcount = (int *)((long)pvVar15 + uVar21);
            *(undefined4 *)((long)pvVar15 + uVar21) = 1;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar17 < 1) {
            return 0;
          }
          fVar30 = *pMVar7->data;
          pvVar16 = pMVar7[1].data;
          uVar21 = 0;
          do {
            fVar29 = powf(fVar30,*(float *)((long)pvVar16 + uVar21 * 4));
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar29;
            uVar21 = uVar21 + 1;
          } while (uVar17 != uVar21);
        }
        else if (iVar2 == 2) {
          Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar17 < 1) {
            return 0;
          }
          fVar30 = *pMVar7->data;
          pvVar16 = pMVar7[1].data;
          uVar21 = 0;
          do {
            fVar29 = powf(fVar30,*(float *)((long)pvVar16 + uVar21 * 4));
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar29;
            uVar21 = uVar21 + 1;
          } while (uVar17 != uVar21);
        }
        else if (iVar2 == 3) {
          Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar5) {
              fVar30 = *pMVar7->data;
              pvVar16 = pMVar7[1].data;
              sVar27 = pMVar7[1].elemsize;
              sVar28 = this_00->elemsize;
              sVar9 = pMVar7[1].cstep;
              uVar23 = 0;
              do {
                if (0 < (int)uVar17) {
                  uVar19 = 0;
                  do {
                    fVar29 = powf(fVar30,*(float *)((long)pvVar16 + uVar19 * 4));
                    *(float *)((long)pvVar15 + uVar19 * 4) = fVar29;
                    uVar19 = uVar19 + 1;
                  } while (uVar17 != uVar19);
                }
                uVar23 = uVar23 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
                pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
              } while (uVar23 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else if (iVar2 == 1) {
        pAVar11 = opt->blob_allocator;
        if (((this_00->dims == 1) && (this_00->w == uVar1)) &&
           ((this_00->elemsize == sVar8 && (this_00->allocator == pAVar11)))) {
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
        }
        else {
          piVar13 = this_00->refcount;
          if (piVar13 != (int *)0x0) {
            LOCK();
            *piVar13 = *piVar13 + -1;
            UNLOCK();
            if (*piVar13 == 0) {
              if (this_00->allocator == (Allocator *)0x0) {
                if (this_00->data != (void *)0x0) {
                  free(*(void **)((long)this_00->data + -8));
                }
              }
              else {
                (**(code **)(*(long *)this_00->allocator + 8))();
              }
            }
          }
          this_00->data = (void *)0x0;
          this_00->refcount = (int *)0x0;
          this_00->elemsize = sVar8;
          this_00->allocator = pAVar11;
          this_00->dims = 1;
          this_00->w = uVar1;
          this_00->h = 1;
          this_00->c = 1;
          this_00->cstep = sVar28;
          if (uVar1 == 0) {
            return -100;
          }
          uVar21 = sVar8 * sVar28 + 3 & 0xfffffffffffffffc;
          if (pAVar11 == (Allocator *)0x0) {
            pvVar16 = malloc(uVar21 + 0x1c);
            pvVar15 = (void *)((long)pvVar16 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar15 + -8) = pvVar16;
          }
          else {
            pvVar15 = (void *)(*(code *)**(undefined8 **)pAVar11)(pAVar11,uVar21 + 4);
          }
          this_00->data = pvVar15;
          this_00->refcount = (int *)((long)pvVar15 + uVar21);
          *(undefined4 *)((long)pvVar15 + uVar21) = 1;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w == 1) {
          if ((int)uVar14 < 1) {
            return 0;
          }
          fVar30 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          uVar21 = 0;
          do {
            fVar29 = powf(*(float *)((long)pvVar16 + uVar21 * 4),fVar30);
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar29;
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
        }
        else {
          if ((int)uVar14 < 1) {
            return 0;
          }
          pvVar16 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          uVar21 = 0;
          do {
            fVar30 = powf(*(float *)((long)pvVar16 + uVar21 * 4),
                          *(float *)((long)pvVar22 + uVar21 * 4));
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar30;
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
        }
      }
      else {
        if (iVar2 == 2) {
          Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar4) {
              pvVar16 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              lVar26 = 0;
              do {
                if (0 < (int)uVar3) {
                  fVar30 = *(float *)((long)pvVar16 + lVar26 * 4);
                  uVar21 = 0;
                  do {
                    fVar29 = powf(fVar30,*(float *)((long)pvVar22 + uVar21 * 4));
                    *(float *)((long)pvVar15 + uVar21 * 4) = fVar29;
                    uVar21 = uVar21 + 1;
                  } while (uVar3 != uVar21);
                }
                lVar26 = lVar26 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar27 * 4);
                pvVar22 = (void *)((long)pvVar22 + sVar27 * 4);
              } while (lVar26 != lVar18);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar2 == 3) {
          Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar5) {
              pvVar16 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              sVar27 = pMVar7[1].elemsize;
              sVar28 = this_00->elemsize;
              sVar9 = pMVar7[1].cstep;
              uVar23 = 0;
              do {
                if (0 < (int)uVar17) {
                  fVar30 = *(float *)((long)pvVar16 + uVar23 * 4);
                  uVar19 = 0;
                  do {
                    fVar29 = powf(fVar30,*(float *)((long)pvVar22 + uVar19 * 4));
                    *(float *)((long)pvVar15 + uVar19 * 4) = fVar29;
                    uVar19 = uVar19 + 1;
                  } while (uVar17 != uVar19);
                }
                uVar23 = uVar23 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
                pvVar22 = (void *)((long)pvVar22 + sVar27 * sVar9);
              } while (uVar23 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
    }
    else if (iVar6 == 2) {
      if (pMVar7[1].dims == 3) {
        Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
        local_58 = this_00->data;
        if (local_58 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 != 0) {
          if (0 < (int)uVar5) {
            pvVar15 = pMVar7->data;
            local_48 = pMVar7[1].data;
            sVar28 = pMVar7[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = pMVar7[1].cstep;
            local_68 = 0;
            do {
              if (0 < iVar4) {
                lVar26 = 0;
                pvVar16 = local_58;
                pvVar22 = local_48;
                do {
                  if (0 < (int)uVar3) {
                    fVar30 = *(float *)((long)pvVar15 + lVar26 * 4 + local_68 * lVar18 * 4);
                    uVar23 = 0;
                    do {
                      fVar29 = powf(fVar30,*(float *)((long)pvVar22 + uVar23 * 4));
                      *(float *)((long)pvVar16 + uVar23 * 4) = fVar29;
                      uVar23 = uVar23 + 1;
                    } while (uVar3 != uVar23);
                  }
                  lVar26 = lVar26 + 1;
                  pvVar16 = (void *)((long)pvVar16 + sVar27 * 4);
                  pvVar22 = (void *)((long)pvVar22 + sVar27 * 4);
                } while (lVar26 != lVar18);
              }
              local_68 = local_68 + 1;
              local_58 = (void *)((long)local_58 + sVar8 * sVar9);
              local_48 = (void *)((long)local_48 + sVar28 * sVar10);
            } while (local_68 != uVar21);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar7[1].dims == 1) {
        Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w != 1) {
          if (0 < iVar2) {
            pvVar16 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            lVar18 = 0;
            do {
              if (0 < (int)uVar1) {
                fVar30 = *(float *)((long)pvVar22 + lVar18 * 4);
                uVar21 = 0;
                do {
                  fVar29 = powf(*(float *)((long)pvVar16 + uVar21 * 4),fVar30);
                  *(float *)((long)pvVar15 + uVar21 * 4) = fVar29;
                  uVar21 = uVar21 + 1;
                } while (uVar1 != uVar21);
              }
              lVar18 = lVar18 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar28 * 4);
              pvVar16 = (void *)((long)pvVar16 + sVar28 * 4);
            } while (lVar18 != lVar26);
            return 0;
          }
          return 0;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        fVar30 = *pMVar7[1].data;
        pvVar16 = pMVar7->data;
        uVar21 = 0;
        do {
          fVar29 = powf(*(float *)((long)pvVar16 + uVar21 * 4),fVar30);
          *(float *)((long)pvVar15 + uVar21 * 4) = fVar29;
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
      }
      else if (pMVar7[1].dims == 2) {
        if ((int)uVar14 < 1) {
          return 0;
        }
        pvVar16 = pMVar7->data;
        pvVar22 = pMVar7[1].data;
        uVar21 = 0;
        do {
          fVar30 = powf(*(float *)((long)pvVar16 + uVar21 * 4),
                        *(float *)((long)pvVar22 + uVar21 * 4));
          *(float *)((long)pvVar15 + uVar21 * 4) = fVar30;
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
      }
    }
    else if (iVar6 == 3) {
      uVar3 = pMVar7->c;
      uVar21 = (ulong)uVar3;
      Mat::create(this_00,uVar1,iVar2,uVar3,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      iVar4 = pMVar7[1].dims;
      if (iVar4 == 1) {
        if (pMVar7[1].w != 1) {
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar27 = pMVar7->elemsize;
            pvVar22 = pMVar7[1].data;
            sVar28 = this_00->elemsize;
            sVar9 = pMVar7->cstep;
            uVar19 = 0;
            do {
              if (0 < (int)uVar14) {
                fVar30 = *(float *)((long)pvVar22 + uVar19 * 4);
                uVar20 = 0;
                do {
                  fVar29 = powf(*(float *)((long)pvVar16 + uVar20 * 4),fVar30);
                  *(float *)((long)pvVar15 + uVar20 * 4) = fVar29;
                  uVar20 = uVar20 + 1;
                } while (uVar23 != uVar20);
              }
              uVar19 = uVar19 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
              pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
            } while (uVar19 != uVar21);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar3) {
          fVar30 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          sVar27 = pMVar7->elemsize;
          sVar28 = this_00->elemsize;
          sVar9 = pMVar7->cstep;
          uVar19 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar20 = 0;
              do {
                fVar29 = powf(*(float *)((long)pvVar16 + uVar20 * 4),fVar30);
                *(float *)((long)pvVar15 + uVar20 * 4) = fVar29;
                uVar20 = uVar20 + 1;
              } while (uVar23 != uVar20);
            }
            uVar19 = uVar19 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
            pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
          } while (uVar19 != uVar21);
          return 0;
        }
        return 0;
      }
      if (iVar4 == 3) {
        if (0 < (int)uVar3) {
          pvVar16 = pMVar7->data;
          sVar27 = pMVar7->elemsize;
          pvVar22 = pMVar7[1].data;
          sVar28 = pMVar7[1].elemsize;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar7[1].cstep;
          sVar12 = pMVar7->cstep;
          uVar19 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar20 = 0;
              do {
                fVar30 = powf(*(float *)((long)pvVar16 + uVar20 * 4),
                              *(float *)((long)pvVar22 + uVar20 * 4));
                *(float *)((long)pvVar15 + uVar20 * 4) = fVar30;
                uVar20 = uVar20 + 1;
              } while (uVar23 != uVar20);
            }
            uVar19 = uVar19 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
            pvVar22 = (void *)((long)pvVar22 + sVar28 * sVar10);
            pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar12);
          } while (uVar19 != uVar21);
          return 0;
        }
        return 0;
      }
      if (iVar4 == 2) {
        if (0 < (int)uVar3) {
          local_50 = pMVar7->data;
          sVar27 = pMVar7->elemsize;
          pvVar16 = pMVar7[1].data;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar7->cstep;
          local_58 = (void *)0x0;
          do {
            if (0 < iVar2) {
              lVar18 = 0;
              pvVar22 = local_50;
              pvVar24 = pvVar15;
              do {
                if (0 < (int)uVar1) {
                  fVar30 = *(float *)((long)pvVar16 + lVar18 * 4 + (long)local_58 * lVar26 * 4);
                  uVar23 = 0;
                  do {
                    fVar29 = powf(*(float *)((long)pvVar22 + uVar23 * 4),fVar30);
                    *(float *)((long)pvVar24 + uVar23 * 4) = fVar29;
                    uVar23 = uVar23 + 1;
                  } while (uVar1 != uVar23);
                }
                lVar18 = lVar18 + 1;
                pvVar24 = (void *)((long)pvVar24 + sVar28 * 4);
                pvVar22 = (void *)((long)pvVar22 + sVar28 * 4);
              } while (lVar18 != lVar26);
            }
            local_58 = (void *)((long)local_58 + 1);
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
            local_50 = (void *)((long)local_50 + sVar27 * sVar10);
          } while (local_58 != (void *)uVar21);
          return 0;
        }
        return 0;
      }
    }
    break;
  case 7:
    uVar1 = pMVar7->w;
    sVar27 = (size_t)(int)uVar1;
    iVar2 = pMVar7->h;
    lVar18 = (long)iVar2;
    uVar14 = iVar2 * uVar1;
    sVar8 = pMVar7->elemsize;
    uVar3 = pMVar7[1].w;
    sVar28 = (size_t)(int)uVar3;
    iVar4 = pMVar7[1].h;
    lVar26 = (long)iVar4;
    uVar5 = pMVar7[1].c;
    uVar21 = (ulong)uVar5;
    iVar6 = pMVar7->dims;
    if (iVar6 == 1) {
      uVar17 = iVar4 * uVar3;
      iVar2 = pMVar7[1].dims;
      if (uVar1 == 1) {
        if (iVar2 == 1) {
          pAVar11 = opt->blob_allocator;
          if ((((this_00->dims == 1) && (this_00->w == uVar3)) && (this_00->elemsize == sVar8)) &&
             (this_00->allocator == pAVar11)) {
            pvVar15 = this_00->data;
            if (pvVar15 == (void *)0x0) {
              return -100;
            }
          }
          else {
            piVar13 = this_00->refcount;
            if (piVar13 != (int *)0x0) {
              LOCK();
              *piVar13 = *piVar13 + -1;
              UNLOCK();
              if (*piVar13 == 0) {
                if (this_00->allocator == (Allocator *)0x0) {
                  if (this_00->data != (void *)0x0) {
                    free(*(void **)((long)this_00->data + -8));
                  }
                }
                else {
                  (**(code **)(*(long *)this_00->allocator + 8))();
                }
              }
            }
            this_00->data = (void *)0x0;
            this_00->refcount = (int *)0x0;
            this_00->elemsize = sVar8;
            this_00->allocator = pAVar11;
            this_00->dims = 1;
            this_00->w = uVar3;
            this_00->h = 1;
            this_00->c = 1;
            this_00->cstep = sVar28;
            if (uVar3 == 0) {
              return -100;
            }
            uVar21 = sVar8 * sVar28 + 3 & 0xfffffffffffffffc;
            if (pAVar11 == (Allocator *)0x0) {
              pvVar16 = malloc(uVar21 + 0x1c);
              pvVar15 = (void *)((long)pvVar16 + 0x17U & 0xfffffffffffffff0);
              *(void **)((long)pvVar15 + -8) = pvVar16;
            }
            else {
              pvVar15 = (void *)(*(code *)**(undefined8 **)pAVar11)(pAVar11);
            }
            this_00->data = pvVar15;
            this_00->refcount = (int *)((long)pvVar15 + uVar21);
            *(undefined4 *)((long)pvVar15 + uVar21) = 1;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar17 < 1) {
            return 0;
          }
          fVar30 = *pMVar7->data;
          pvVar16 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = *(float *)((long)pvVar16 + uVar21 * 4) - fVar30
            ;
            uVar21 = uVar21 + 1;
          } while (uVar17 != uVar21);
        }
        else if (iVar2 == 2) {
          Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar17 < 1) {
            return 0;
          }
          fVar30 = *pMVar7->data;
          pvVar16 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = *(float *)((long)pvVar16 + uVar21 * 4) - fVar30
            ;
            uVar21 = uVar21 + 1;
          } while (uVar17 != uVar21);
        }
        else if (iVar2 == 3) {
          Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar5) {
              fVar30 = *pMVar7->data;
              pvVar16 = pMVar7[1].data;
              sVar27 = pMVar7[1].elemsize;
              sVar28 = this_00->elemsize;
              sVar9 = pMVar7[1].cstep;
              uVar23 = 0;
              do {
                if (0 < (int)uVar17) {
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar16 + uVar19 * 4) - fVar30;
                    uVar19 = uVar19 + 1;
                  } while (uVar17 != uVar19);
                }
                uVar23 = uVar23 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
                pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
              } while (uVar23 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else if (iVar2 == 1) {
        pAVar11 = opt->blob_allocator;
        if (((this_00->dims == 1) && (this_00->w == uVar1)) &&
           ((this_00->elemsize == sVar8 && (this_00->allocator == pAVar11)))) {
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
        }
        else {
          piVar13 = this_00->refcount;
          if (piVar13 != (int *)0x0) {
            LOCK();
            *piVar13 = *piVar13 + -1;
            UNLOCK();
            if (*piVar13 == 0) {
              if (this_00->allocator == (Allocator *)0x0) {
                if (this_00->data != (void *)0x0) {
                  free(*(void **)((long)this_00->data + -8));
                }
              }
              else {
                (**(code **)(*(long *)this_00->allocator + 8))();
              }
            }
          }
          this_00->data = (void *)0x0;
          this_00->refcount = (int *)0x0;
          this_00->elemsize = sVar8;
          this_00->allocator = pAVar11;
          this_00->dims = 1;
          this_00->w = uVar1;
          this_00->h = 1;
          this_00->c = 1;
          this_00->cstep = sVar27;
          if (uVar1 == 0) {
            return -100;
          }
          uVar21 = sVar8 * sVar27 + 3 & 0xfffffffffffffffc;
          if (pAVar11 == (Allocator *)0x0) {
            pvVar16 = malloc(uVar21 + 0x1c);
            pvVar15 = (void *)((long)pvVar16 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar15 + -8) = pvVar16;
          }
          else {
            pvVar15 = (void *)(*(code *)**(undefined8 **)pAVar11)();
          }
          this_00->data = pvVar15;
          this_00->refcount = (int *)((long)pvVar15 + uVar21);
          *(undefined4 *)((long)pvVar15 + uVar21) = 1;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w == 1) {
          if ((int)uVar14 < 1) {
            return 0;
          }
          fVar30 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar30 - *(float *)((long)pvVar16 + uVar21 * 4)
            ;
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
        }
        else {
          if ((int)uVar14 < 1) {
            return 0;
          }
          pvVar16 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) =
                 *(float *)((long)pvVar22 + uVar21 * 4) - *(float *)((long)pvVar16 + uVar21 * 4);
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
        }
      }
      else {
        if (iVar2 == 2) {
          Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar4) {
              pvVar16 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              lVar18 = 0;
              do {
                if (0 < (int)uVar3) {
                  fVar30 = *(float *)((long)pvVar16 + lVar18 * 4);
                  uVar21 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar21 * 4) =
                         *(float *)((long)pvVar22 + uVar21 * 4) - fVar30;
                    uVar21 = uVar21 + 1;
                  } while (uVar3 != uVar21);
                }
                lVar18 = lVar18 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar28 * 4);
                pvVar22 = (void *)((long)pvVar22 + sVar28 * 4);
              } while (lVar18 != lVar26);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar2 == 3) {
          Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar5) {
              pvVar16 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              sVar27 = pMVar7[1].elemsize;
              sVar28 = this_00->elemsize;
              sVar9 = pMVar7[1].cstep;
              uVar23 = 0;
              do {
                if (0 < (int)uVar17) {
                  fVar30 = *(float *)((long)pvVar16 + uVar23 * 4);
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar22 + uVar19 * 4) - fVar30;
                    uVar19 = uVar19 + 1;
                  } while (uVar17 != uVar19);
                }
                uVar23 = uVar23 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
                pvVar22 = (void *)((long)pvVar22 + sVar27 * sVar9);
              } while (uVar23 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
    }
    else if (iVar6 == 2) {
      if (pMVar7[1].dims == 3) {
        Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 != 0) {
          if (0 < (int)uVar5) {
            pvVar16 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            sVar27 = pMVar7[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = pMVar7[1].cstep;
            uVar23 = 0;
            do {
              if (0 < iVar4) {
                lVar18 = 0;
                pvVar24 = pvVar22;
                pvVar25 = pvVar15;
                do {
                  if (0 < (int)uVar3) {
                    fVar30 = *(float *)((long)pvVar16 + lVar18 * 4 + uVar23 * lVar26 * 4);
                    uVar19 = 0;
                    do {
                      *(float *)((long)pvVar25 + uVar19 * 4) =
                           *(float *)((long)pvVar24 + uVar19 * 4) - fVar30;
                      uVar19 = uVar19 + 1;
                    } while (uVar3 != uVar19);
                  }
                  lVar18 = lVar18 + 1;
                  pvVar25 = (void *)((long)pvVar25 + sVar28 * 4);
                  pvVar24 = (void *)((long)pvVar24 + sVar28 * 4);
                } while (lVar18 != lVar26);
              }
              uVar23 = uVar23 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar27 * sVar10);
            } while (uVar23 != uVar21);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar7[1].dims == 1) {
        Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w != 1) {
          if (0 < iVar2) {
            pvVar16 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            lVar26 = 0;
            do {
              if (0 < (int)uVar1) {
                fVar30 = *(float *)((long)pvVar22 + lVar26 * 4);
                uVar21 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar21 * 4) =
                       fVar30 - *(float *)((long)pvVar16 + uVar21 * 4);
                  uVar21 = uVar21 + 1;
                } while (uVar1 != uVar21);
              }
              lVar26 = lVar26 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar27 * 4);
              pvVar16 = (void *)((long)pvVar16 + sVar27 * 4);
            } while (lVar26 != lVar18);
            return 0;
          }
          return 0;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        fVar30 = *pMVar7[1].data;
        pvVar16 = pMVar7->data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar15 + uVar21 * 4) = fVar30 - *(float *)((long)pvVar16 + uVar21 * 4);
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
      }
      else if (pMVar7[1].dims == 2) {
        if ((int)uVar14 < 1) {
          return 0;
        }
        pvVar16 = pMVar7->data;
        pvVar22 = pMVar7[1].data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar15 + uVar21 * 4) =
               *(float *)((long)pvVar22 + uVar21 * 4) - *(float *)((long)pvVar16 + uVar21 * 4);
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
      }
    }
    else if (iVar6 == 3) {
      uVar3 = pMVar7->c;
      uVar21 = (ulong)uVar3;
      Mat::create(this_00,uVar1,iVar2,uVar3,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      iVar4 = pMVar7[1].dims;
      if (iVar4 == 1) {
        if (pMVar7[1].w != 1) {
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar27 = pMVar7->elemsize;
            pvVar22 = pMVar7[1].data;
            sVar28 = this_00->elemsize;
            sVar9 = pMVar7->cstep;
            uVar23 = 0;
            do {
              if (0 < (int)uVar14) {
                fVar30 = *(float *)((long)pvVar22 + uVar23 * 4);
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar19 * 4) =
                       fVar30 - *(float *)((long)pvVar16 + uVar19 * 4);
                  uVar19 = uVar19 + 1;
                } while (uVar14 != uVar19);
              }
              uVar23 = uVar23 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
              pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
            } while (uVar23 != uVar21);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar3) {
          fVar30 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          sVar27 = pMVar7->elemsize;
          sVar28 = this_00->elemsize;
          sVar9 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar19 = 0;
              do {
                *(float *)((long)pvVar15 + uVar19 * 4) =
                     fVar30 - *(float *)((long)pvVar16 + uVar19 * 4);
                uVar19 = uVar19 + 1;
              } while (uVar14 != uVar19);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
            pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
          } while (uVar23 != uVar21);
          return 0;
        }
        return 0;
      }
      if (iVar4 == 3) {
        if (0 < (int)uVar3) {
          pvVar16 = pMVar7->data;
          sVar27 = pMVar7->elemsize;
          pvVar22 = pMVar7[1].data;
          sVar28 = pMVar7[1].elemsize;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar7[1].cstep;
          sVar12 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar19 = 0;
              do {
                *(float *)((long)pvVar15 + uVar19 * 4) =
                     *(float *)((long)pvVar22 + uVar19 * 4) - *(float *)((long)pvVar16 + uVar19 * 4)
                ;
                uVar19 = uVar19 + 1;
              } while (uVar14 != uVar19);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
            pvVar22 = (void *)((long)pvVar22 + sVar28 * sVar10);
            pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar12);
          } while (uVar23 != uVar21);
          return 0;
        }
        return 0;
      }
      if (iVar4 == 2) {
        if (0 < (int)uVar3) {
          pvVar16 = pMVar7->data;
          sVar28 = pMVar7->elemsize;
          pvVar22 = pMVar7[1].data;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < iVar2) {
              lVar26 = 0;
              pvVar24 = pvVar16;
              pvVar25 = pvVar15;
              do {
                if (0 < (int)uVar1) {
                  fVar30 = *(float *)((long)pvVar22 + lVar26 * 4 + uVar23 * lVar18 * 4);
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar25 + uVar19 * 4) =
                         fVar30 - *(float *)((long)pvVar24 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar1 != uVar19);
                }
                lVar26 = lVar26 + 1;
                pvVar25 = (void *)((long)pvVar25 + sVar27 * 4);
                pvVar24 = (void *)((long)pvVar24 + sVar27 * 4);
              } while (lVar26 != lVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
            pvVar16 = (void *)((long)pvVar16 + sVar28 * sVar10);
          } while (uVar23 != uVar21);
          return 0;
        }
        return 0;
      }
    }
    break;
  case 8:
    uVar1 = pMVar7->w;
    sVar28 = (size_t)(int)uVar1;
    iVar2 = pMVar7->h;
    lVar18 = (long)iVar2;
    uVar14 = iVar2 * uVar1;
    sVar8 = pMVar7->elemsize;
    uVar3 = pMVar7[1].w;
    sVar27 = (size_t)(int)uVar3;
    iVar4 = pMVar7[1].h;
    lVar26 = (long)iVar4;
    uVar5 = pMVar7[1].c;
    uVar21 = (ulong)uVar5;
    iVar6 = pMVar7->dims;
    if (iVar6 != 1) {
      if (iVar6 != 2) {
        if (iVar6 != 3) {
          return 0;
        }
        uVar3 = pMVar7->c;
        uVar21 = (ulong)uVar3;
        Mat::create(this_00,uVar1,iVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        iVar4 = pMVar7[1].dims;
        if (iVar4 != 1) {
          if (iVar4 == 3) {
            if (0 < (int)uVar3) {
              pvVar16 = pMVar7->data;
              sVar27 = pMVar7->elemsize;
              pvVar22 = pMVar7[1].data;
              sVar28 = pMVar7[1].elemsize;
              sVar9 = this_00->elemsize;
              sVar10 = pMVar7[1].cstep;
              sVar12 = pMVar7->cstep;
              uVar23 = 0;
              do {
                if (0 < (int)uVar14) {
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar22 + uVar19 * 4) /
                         *(float *)((long)pvVar16 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar14 != uVar19);
                }
                uVar23 = uVar23 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
                pvVar22 = (void *)((long)pvVar22 + sVar28 * sVar10);
                pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar12);
              } while (uVar23 != uVar21);
              return 0;
            }
            return 0;
          }
          if (iVar4 != 2) {
            return 0;
          }
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar27 = pMVar7->elemsize;
            pvVar22 = pMVar7[1].data;
            sVar9 = this_00->elemsize;
            sVar10 = pMVar7->cstep;
            uVar23 = 0;
            do {
              if (0 < iVar2) {
                lVar26 = 0;
                pvVar24 = pvVar16;
                pvVar25 = pvVar15;
                do {
                  if (0 < (int)uVar1) {
                    fVar30 = *(float *)((long)pvVar22 + lVar26 * 4 + uVar23 * lVar18 * 4);
                    uVar19 = 0;
                    do {
                      *(float *)((long)pvVar25 + uVar19 * 4) =
                           fVar30 / *(float *)((long)pvVar24 + uVar19 * 4);
                      uVar19 = uVar19 + 1;
                    } while (uVar1 != uVar19);
                  }
                  lVar26 = lVar26 + 1;
                  pvVar25 = (void *)((long)pvVar25 + sVar28 * 4);
                  pvVar24 = (void *)((long)pvVar24 + sVar28 * 4);
                } while (lVar26 != lVar18);
              }
              uVar23 = uVar23 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
              pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar10);
            } while (uVar23 != uVar21);
            return 0;
          }
          return 0;
        }
        if (pMVar7[1].w != 1) {
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar27 = pMVar7->elemsize;
            pvVar22 = pMVar7[1].data;
            sVar28 = this_00->elemsize;
            sVar9 = pMVar7->cstep;
            uVar23 = 0;
            do {
              if (0 < (int)uVar14) {
                fVar30 = *(float *)((long)pvVar22 + uVar23 * 4);
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar19 * 4) =
                       fVar30 / *(float *)((long)pvVar16 + uVar19 * 4);
                  uVar19 = uVar19 + 1;
                } while (uVar14 != uVar19);
              }
              uVar23 = uVar23 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
              pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
            } while (uVar23 != uVar21);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar3) {
          fVar30 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          sVar27 = pMVar7->elemsize;
          sVar28 = this_00->elemsize;
          sVar9 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar19 = 0;
              do {
                *(float *)((long)pvVar15 + uVar19 * 4) =
                     fVar30 / *(float *)((long)pvVar16 + uVar19 * 4);
                uVar19 = uVar19 + 1;
              } while (uVar14 != uVar19);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
            pvVar16 = (void *)((long)pvVar16 + sVar27 * sVar9);
          } while (uVar23 != uVar21);
          return 0;
        }
        return 0;
      }
      if (pMVar7[1].dims == 3) {
        Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 != 0) {
          if (0 < (int)uVar5) {
            pvVar16 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            sVar28 = pMVar7[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = pMVar7[1].cstep;
            uVar23 = 0;
            do {
              if (0 < iVar4) {
                lVar18 = 0;
                pvVar24 = pvVar22;
                pvVar25 = pvVar15;
                do {
                  if (0 < (int)uVar3) {
                    fVar30 = *(float *)((long)pvVar16 + lVar18 * 4 + uVar23 * lVar26 * 4);
                    uVar19 = 0;
                    do {
                      *(float *)((long)pvVar25 + uVar19 * 4) =
                           *(float *)((long)pvVar24 + uVar19 * 4) * (1.0 / fVar30);
                      uVar19 = uVar19 + 1;
                    } while (uVar3 != uVar19);
                  }
                  lVar18 = lVar18 + 1;
                  pvVar25 = (void *)((long)pvVar25 + sVar27 * 4);
                  pvVar24 = (void *)((long)pvVar24 + sVar27 * 4);
                } while (lVar18 != lVar26);
              }
              uVar23 = uVar23 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar28 * sVar10);
            } while (uVar23 != uVar21);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar7[1].dims == 1) {
        Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w != 1) {
          if (0 < iVar2) {
            pvVar16 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            lVar26 = 0;
            do {
              if (0 < (int)uVar1) {
                fVar30 = *(float *)((long)pvVar22 + lVar26 * 4);
                uVar21 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar21 * 4) =
                       fVar30 / *(float *)((long)pvVar16 + uVar21 * 4);
                  uVar21 = uVar21 + 1;
                } while (uVar1 != uVar21);
              }
              lVar26 = lVar26 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar28 * 4);
              pvVar16 = (void *)((long)pvVar16 + sVar28 * 4);
            } while (lVar26 != lVar18);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar14) {
          fVar30 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar30 / *(float *)((long)pvVar16 + uVar21 * 4)
            ;
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
          return 0;
        }
        return 0;
      }
      if (pMVar7[1].dims != 2) {
        return 0;
      }
      if (0 < (int)uVar14) {
        pvVar16 = pMVar7->data;
        pvVar22 = pMVar7[1].data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar15 + uVar21 * 4) =
               *(float *)((long)pvVar22 + uVar21 * 4) / *(float *)((long)pvVar16 + uVar21 * 4);
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
        return 0;
      }
      return 0;
    }
    uVar17 = iVar4 * uVar3;
    iVar2 = pMVar7[1].dims;
    if (uVar1 == 1) {
      if (iVar2 == 1) {
        pAVar11 = opt->blob_allocator;
        if ((((this_00->dims == 1) && (this_00->w == uVar3)) && (this_00->elemsize == sVar8)) &&
           (this_00->allocator == pAVar11)) {
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
        }
        else {
          piVar13 = this_00->refcount;
          if (piVar13 != (int *)0x0) {
            LOCK();
            *piVar13 = *piVar13 + -1;
            UNLOCK();
            if (*piVar13 == 0) {
              if (this_00->allocator == (Allocator *)0x0) {
                if (this_00->data != (void *)0x0) {
                  free(*(void **)((long)this_00->data + -8));
                }
              }
              else {
                (**(code **)(*(long *)this_00->allocator + 8))();
              }
            }
          }
          this_00->data = (void *)0x0;
          this_00->refcount = (int *)0x0;
          this_00->elemsize = sVar8;
          this_00->allocator = pAVar11;
          this_00->dims = 1;
          this_00->w = uVar3;
          this_00->h = 1;
          this_00->c = 1;
          this_00->cstep = sVar27;
          if (uVar3 == 0) {
            return -100;
          }
          uVar21 = sVar8 * sVar27 + 3 & 0xfffffffffffffffc;
          if (pAVar11 == (Allocator *)0x0) {
            pvVar16 = malloc(uVar21 + 0x1c);
            pvVar15 = (void *)((long)pvVar16 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar15 + -8) = pvVar16;
          }
          else {
            pvVar15 = (void *)(*(code *)**(undefined8 **)pAVar11)(pAVar11,uVar21 + 4);
          }
          this_00->data = pvVar15;
          this_00->refcount = (int *)((long)pvVar15 + uVar21);
          *(undefined4 *)((long)pvVar15 + uVar21) = 1;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar17) {
          pvVar16 = pMVar7[1].data;
          fVar30 = *pMVar7->data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) =
                 *(float *)((long)pvVar16 + uVar21 * 4) * (1.0 / fVar30);
            uVar21 = uVar21 + 1;
          } while (uVar17 != uVar21);
          return 0;
        }
        return 0;
      }
      if (iVar2 == 2) {
        Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar17) {
            pvVar16 = pMVar7[1].data;
            fVar30 = *pMVar7->data;
            uVar21 = 0;
            do {
              *(float *)((long)pvVar15 + uVar21 * 4) =
                   *(float *)((long)pvVar16 + uVar21 * 4) * (1.0 / fVar30);
              uVar21 = uVar21 + 1;
            } while (uVar17 != uVar21);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar2 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      if (0 < (int)uVar5) {
        pvVar16 = pMVar7[1].data;
        sVar27 = this_00->elemsize;
        sVar28 = pMVar7[1].elemsize;
        fVar30 = *pMVar7->data;
        sVar9 = pMVar7[1].cstep;
        uVar23 = 0;
        do {
          if (0 < (int)uVar17) {
            uVar19 = 0;
            do {
              *(float *)((long)pvVar15 + uVar19 * 4) =
                   *(float *)((long)pvVar16 + uVar19 * 4) * (1.0 / fVar30);
              uVar19 = uVar19 + 1;
            } while (uVar17 != uVar19);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar27);
          pvVar16 = (void *)((long)pvVar16 + sVar28 * sVar9);
        } while (uVar23 != uVar21);
        return 0;
      }
      return 0;
    }
    if (iVar2 == 1) {
      pAVar11 = opt->blob_allocator;
      if (((this_00->dims == 1) && (this_00->w == uVar1)) &&
         ((this_00->elemsize == sVar8 && (this_00->allocator == pAVar11)))) {
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
      }
      else {
        piVar13 = this_00->refcount;
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            if (this_00->allocator == (Allocator *)0x0) {
              if (this_00->data != (void *)0x0) {
                free(*(void **)((long)this_00->data + -8));
              }
            }
            else {
              (**(code **)(*(long *)this_00->allocator + 8))();
            }
          }
        }
        this_00->data = (void *)0x0;
        this_00->refcount = (int *)0x0;
        this_00->elemsize = sVar8;
        this_00->allocator = pAVar11;
        this_00->dims = 1;
        this_00->w = uVar1;
        this_00->h = 1;
        this_00->c = 1;
        this_00->cstep = sVar28;
        if (uVar1 == 0) {
          return -100;
        }
        uVar21 = sVar8 * sVar28 + 3 & 0xfffffffffffffffc;
        if (pAVar11 == (Allocator *)0x0) {
          pvVar16 = malloc(uVar21 + 0x1c);
          pvVar15 = (void *)((long)pvVar16 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar15 + -8) = pvVar16;
        }
        else {
          pvVar15 = (void *)(*(code *)**(undefined8 **)pAVar11)();
        }
        this_00->data = pvVar15;
        this_00->refcount = (int *)((long)pvVar15 + uVar21);
        *(undefined4 *)((long)pvVar15 + uVar21) = 1;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar7[1].w == 1) {
        if (0 < (int)uVar14) {
          fVar30 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar30 / *(float *)((long)pvVar16 + uVar21 * 4)
            ;
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
          return 0;
        }
        return 0;
      }
      if (0 < (int)uVar14) {
        pvVar16 = pMVar7->data;
        pvVar22 = pMVar7[1].data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar15 + uVar21 * 4) =
               *(float *)((long)pvVar22 + uVar21 * 4) / *(float *)((long)pvVar16 + uVar21 * 4);
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
        return 0;
      }
      return 0;
    }
    if (iVar2 == 2) {
      Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < iVar4) {
          pvVar16 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          lVar18 = 0;
          do {
            if (0 < (int)uVar3) {
              fVar30 = *(float *)((long)pvVar16 + lVar18 * 4);
              uVar21 = 0;
              do {
                *(float *)((long)pvVar15 + uVar21 * 4) =
                     *(float *)((long)pvVar22 + uVar21 * 4) * (1.0 / fVar30);
                uVar21 = uVar21 + 1;
              } while (uVar3 != uVar21);
            }
            lVar18 = lVar18 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar27 * 4);
            pvVar22 = (void *)((long)pvVar22 + sVar27 * 4);
          } while (lVar18 != lVar26);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar2 != 3) {
      return 0;
    }
    Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    sVar8 = this_00->cstep;
    if ((long)this_00->c * sVar8 == 0) {
      return -100;
    }
    if (0 < (int)uVar5) {
      pvVar16 = pMVar7->data;
      pvVar22 = pMVar7[1].data;
      sVar27 = pMVar7[1].elemsize;
      sVar28 = this_00->elemsize;
      sVar9 = pMVar7[1].cstep;
      uVar23 = 0;
      do {
        if (0 < (int)uVar17) {
          fVar30 = *(float *)((long)pvVar16 + uVar23 * 4);
          uVar19 = 0;
          do {
            *(float *)((long)pvVar15 + uVar19 * 4) =
                 *(float *)((long)pvVar22 + uVar19 * 4) * (1.0 / fVar30);
            uVar19 = uVar19 + 1;
          } while (uVar17 != uVar19);
        }
        uVar23 = uVar23 + 1;
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar28);
        pvVar22 = (void *)((long)pvVar22 + sVar27 * sVar9);
      } while (uVar23 != uVar21);
      return 0;
    }
    return 0;
  }
  return 0;
}

Assistant:

int BinaryOp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];

    if (op_type == Operation_ADD)
        return binary_op< std::plus<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_SUB)
        return binary_op< std::minus<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MUL)
        return binary_op< std::multiplies<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_DIV)
        return binary_op< std::divides<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MAX)
        return binary_op< binary_op_max<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MIN)
        return binary_op< binary_op_min<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_POW)
        return binary_op< binary_op_pow<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RSUB)
        return binary_op< binary_op_rsub<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RDIV)
        return binary_op< binary_op_rdiv<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    return 0;
}